

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O2

NodeRecordMB4D * __thiscall
embree::sse2::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<4>,_embree::sse2::GridRecalculatePrimRef,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeafGrid<4>,_embree::Scene::BuildProgressMonitorInterface>
::createLargeLeaf(NodeRecordMB4D *__return_storage_ptr__,
                 BuilderT<embree::NodeRefPtr<4>,_embree::sse2::GridRecalculatePrimRef,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeafGrid<4>,_embree::Scene::BuildProgressMonitorInterface>
                 *this,BuildRecord *in,CachedAllocator alloc)

{
  atomic<unsigned_long> *paVar1;
  char *pcVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  ushort uVar5;
  ushort uVar6;
  size_t end;
  PrimRefVector pmVar7;
  PrimRefVector *ppmVar8;
  MemoryMonitorInterface *pMVar9;
  mvector<embree::PrimRefMB> *pmVar10;
  SubGridBuildData *pSVar11;
  PrimRefVector *ppmVar12;
  int iVar13;
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  BBox1f BVar20;
  BBox1f BVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  long lVar34;
  long lVar35;
  _Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
  _Var36;
  char cVar37;
  size_t i_1;
  ThreadLocal2 *pTVar38;
  long lVar39;
  size_t sVar40;
  vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
  *pvVar41;
  PrimRefMB *pPVar42;
  ulong uVar43;
  size_t sVar44;
  undefined8 *puVar45;
  runtime_error *prVar46;
  int iVar47;
  mvector<PrimRefMB> *prims;
  PrimRefVector pmVar48;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar49;
  float *pfVar50;
  range<unsigned_long> *prVar51;
  ulong uVar52;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar53;
  ThreadLocal2 *pTVar54;
  ulong uVar55;
  ulong uVar56;
  SetMB *this_00;
  ulong uVar57;
  int iVar58;
  size_t i_19;
  size_t i_21;
  char *pcVar59;
  char *pcVar60;
  bool bVar61;
  bool bVar62;
  uint uVar63;
  uint uVar64;
  uint uVar65;
  uint uVar66;
  uint uVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  uint uVar71;
  uint uVar89;
  uint uVar91;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  uint uVar90;
  uint uVar92;
  uint uVar93;
  uint uVar94;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar95;
  uint uVar96;
  uint uVar118;
  uint uVar119;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  uint uVar121;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar122 [16];
  float fVar123;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar131;
  float fVar133;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar132;
  float fVar134;
  float fVar135;
  float fVar136;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  float fVar143;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar147;
  float fVar148;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  new_vector;
  BBox1f time_range1;
  BBox1f time_range0;
  PrimRefVector lprims;
  BBox<embree::Vec3fa> blower1;
  uint x [4];
  uint primID [4];
  uint geomIDs [4];
  uint y [4];
  BBox<embree::Vec3fa> bupper0;
  BBox3fa bounds0 [4];
  vint vSplitPos;
  BBox3fa bounds1 [4];
  BBox<embree::Vec3fa> bi;
  BuildRecordSplit current;
  NodeRecordMB4D values [16];
  LocalChildListSplit children;
  task_group_context *in_stack_ffffffffffffe080;
  undefined1 local_1f60 [16];
  undefined1 local_1f30 [16];
  undefined1 local_1f20 [16];
  float local_1ef0;
  float fStack_1eec;
  undefined1 local_1ed0 [16];
  undefined1 local_1ec0 [16];
  undefined1 local_1eb0 [16];
  _Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
  local_1e90;
  BBox1f local_1e88;
  undefined8 local_1e80;
  PrimRefMB *local_1e78;
  undefined1 local_1e70 [16];
  NodeRecordMB4D *local_1e58;
  undefined1 local_1e50 [16];
  _Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
  local_1e40;
  _Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
  local_1e38;
  undefined1 local_1e30 [8];
  undefined8 uStack_1e28;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1e20;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1e10;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1e00;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1df0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1de0;
  unsigned_long local_1dd0;
  unsigned_long uStack_1dc8;
  size_t local_1dc0;
  size_t sStack_1db8;
  float local_1db0;
  float local_1dac;
  float fStack_1da8;
  float local_1da4;
  vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
  *local_1da0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1d90;
  undefined8 local_1d80;
  undefined1 local_1d70 [8];
  undefined8 uStack_1d68;
  undefined1 local_1d60 [16];
  undefined1 local_1d50 [48];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1d20;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1d10;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1d00;
  anon_class_24_3_35f68c7c local_1cf0;
  undefined1 local_1cd0 [8];
  undefined8 uStack_1cc8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1cc0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1cb0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ca0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1c90;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1c80;
  unsigned_long local_1c70;
  unsigned_long uStack_1c68;
  size_t local_1c60;
  size_t sStack_1c58;
  float local_1c50;
  undefined8 local_1c4c;
  float local_1c44;
  ulong local_1c40;
  ulong local_1c38;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_1c30;
  ulong local_1c28;
  undefined1 local_1c20 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1c10 [4];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1bd0 [2];
  size_t local_1bb0;
  size_t local_1ba8;
  BBox1f local_1b88;
  PrimRefVector local_1b80;
  BinSplit<32UL> local_1b70;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1b30;
  undefined8 *local_1b20;
  BBox1f *local_1b18;
  BuildRecordSplit local_1ab0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_19c0;
  undefined8 local_19b0;
  float fStack_19a8;
  float fStack_19a4;
  unsigned_long local_1960;
  unsigned_long local_1958;
  undefined1 local_1930 [208];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1860;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1850;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1840;
  float local_1830;
  float fStack_182c;
  float fStack_1828;
  float fStack_1824;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1820;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1810;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 local_17f0;
  undefined8 uStack_17e8;
  undefined8 local_17e0;
  undefined8 uStack_17d8;
  undefined8 local_17d0;
  undefined8 uStack_17c8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1240;
  SetMB local_1230;
  undefined1 local_1190 [12];
  uint local_1184 [913];
  PrimRefVector *local_340 [16];
  ulong local_2c0;
  PrimRefVector local_2b8;
  PrimRefVector local_2b0 [63];
  long local_b8;
  undefined8 uVar120;
  
  local_1e50._8_8_ = local_1e50._0_8_;
  local_1e70._8_8_ = local_1e70._0_8_;
  local_1240._0_8_ = in->depth;
  local_1e58 = __return_storage_ptr__;
  if ((undefined8 *)(this->cfg).maxDepth < (ulong)local_1240._0_8_) {
    puVar45 = (undefined8 *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&local_1240.field_1,"depth limit reached",(allocator *)&local_1840.field_1)
    ;
    *puVar45 = &PTR__rtcore_error_021d38e0;
    *(undefined4 *)(puVar45 + 1) = 1;
    std::__cxx11::string::string((string *)(puVar45 + 2),(string *)&local_1240.field_1);
    __cxa_throw(puVar45,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  local_1d60._8_8_ = local_1d60._0_8_;
  local_1d60._0_8_ = in;
  SetMB::SetMB(&local_1230,&in->prims);
  findFallback((Split *)&local_1840.field_1,this,&in->prims);
  BuildRecord::BuildRecord((BuildRecord *)local_1930,(BuildRecord *)&local_1240.field_1);
  local_1930._176_8_ = local_1840._0_8_;
  local_1860._0_8_ = local_1820._0_8_;
  local_1860._8_8_ = local_1820._8_8_;
  local_1850._0_8_ = local_1810._0_8_;
  local_1850._8_8_ = local_1810._8_8_;
  pTVar38 = (ThreadLocal2 *)local_1930._112_8_;
  if (local_1930._0_8_ == 1) {
    if (local_1930._120_8_ == local_1930._112_8_) {
      bVar61 = false;
      pTVar38 = (ThreadLocal2 *)local_1930._120_8_;
    }
    else {
      lVar39 = local_1930._112_8_ * 0x50 + 0x44;
      auVar73._0_12_ = ZEXT812(0x7f800000);
      auVar73._12_4_ = 0;
      fVar148 = -INFINITY;
      for (pTVar54 = (ThreadLocal2 *)local_1930._112_8_; pTVar54 < (ulong)local_1930._120_8_;
          pTVar54 = (ThreadLocal2 *)((long)&(pTVar54->mutex).mutex + 1)) {
        fVar143 = *(float *)((long)*(PrimRefMB **)(local_1930._160_8_ + 0x20) + lVar39 + -4);
        if (fVar143 <= auVar73._0_4_) {
          auVar73._0_4_ = fVar143;
        }
        fVar143 = *(float *)((long)&((*(PrimRefMB **)(local_1930._160_8_ + 0x20))->lbounds).bounds0.
                                    lower.field_0 + lVar39);
        if (fVar143 <= fVar148) {
          fVar143 = fVar148;
        }
        lVar39 = lVar39 + 0x50;
        fVar148 = fVar143;
      }
      bVar61 = (float)local_1930._152_4_ < auVar73._0_4_ || fVar148 < (float)local_1930._156_4_;
    }
  }
  else {
    bVar61 = false;
  }
  uVar57 = local_1930._120_8_ - (long)pTVar38;
  local_1d50._16_8_ = 1;
  if (((uVar57 <= (this->cfg).maxLeafSize) && ((uint)local_1840._12_4_ < 2)) && (!bVar61)) {
    local_1e78 = *(PrimRefMB **)(local_1930._160_8_ + 0x20) + (long)pTVar38;
    pfVar50 = (*(PrimRefMB **)(local_1930._160_8_ + 0x20))[(long)pTVar38].lbounds.bounds0.lower.
              field_0.m128 + 3;
    local_1d20.m128[0] = *pfVar50;
    for (uVar43 = 1; uVar43 < uVar57; uVar43 = uVar43 + 1) {
      fVar148 = pfVar50[uVar43 * 0x14];
      uVar52 = 0;
      do {
        if (local_1d50._16_8_ == uVar52) {
          *(float *)((long)&local_1d20 + local_1d50._16_8_ * 4) = fVar148;
          local_1d50._16_8_ = (ulong)((int)local_1d50._16_8_ + 1);
          break;
        }
        lVar39 = uVar52 * 4;
        uVar52 = uVar52 + 1;
      } while (fVar148 != *(float *)((long)&local_1d20 + lVar39));
    }
    local_1ab0.super_BuildRecord.depth = (size_t)(local_1d50._16_8_ * 0x90);
    pTVar38 = (alloc.talloc1)->parent;
    if (alloc.alloc != (pTVar38->alloc)._M_b._M_p) {
      local_1840._8_1_ = 1;
      local_1840._0_8_ = pTVar38;
      MutexSys::lock(&pTVar38->mutex);
      if ((pTVar38->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar1 = &((pTVar38->alloc)._M_b._M_p)->bytesUsed;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar38->alloc1).bytesUsed + (pTVar38->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar38->alloc)._M_b._M_p)->bytesFree;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar38->alloc0).end + (pTVar38->alloc1).end) -
             ((pTVar38->alloc0).cur + (pTVar38->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar38->alloc)._M_b._M_p)->bytesWasted;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar38->alloc1).bytesWasted + (pTVar38->alloc0).bytesWasted;
        UNLOCK();
      }
      (pTVar38->alloc0).bytesUsed = 0;
      (pTVar38->alloc0).bytesWasted = 0;
      (pTVar38->alloc0).end = 0;
      (pTVar38->alloc0).allocBlockSize = 0;
      (pTVar38->alloc0).ptr = (char *)0x0;
      (pTVar38->alloc0).cur = 0;
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar38->alloc1).bytesUsed = 0;
        (pTVar38->alloc1).bytesWasted = 0;
        (pTVar38->alloc1).end = 0;
        (pTVar38->alloc1).allocBlockSize = 0;
        (pTVar38->alloc1).ptr = (char *)0x0;
        (pTVar38->alloc1).cur = 0;
      }
      else {
        (pTVar38->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar38->alloc1).ptr = (char *)0x0;
        (pTVar38->alloc1).cur = 0;
        (pTVar38->alloc1).end = 0;
        (pTVar38->alloc1).allocBlockSize = 0;
        (pTVar38->alloc1).bytesUsed = 0;
        (pTVar38->alloc1).bytesWasted = 0;
        (pTVar38->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar38->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      local_1240._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
      local_1240._8_1_ = 1;
      local_1c20._0_8_ = pTVar38;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      std::
      vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
      ::push_back(&(alloc.alloc)->thread_local_allocators,(value_type *)local_1c20);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&local_1240.field_1);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&local_1840.field_1);
    }
    (alloc.talloc1)->bytesUsed = local_1ab0.super_BuildRecord.depth + (alloc.talloc1)->bytesUsed;
    sVar44 = (alloc.talloc1)->cur;
    uVar43 = (ulong)(-(int)sVar44 & 0xf);
    uVar52 = local_1ab0.super_BuildRecord.depth + uVar43 + sVar44;
    (alloc.talloc1)->cur = uVar52;
    if ((alloc.talloc1)->end < uVar52) {
      (alloc.talloc1)->cur = sVar44;
      if ((undefined8 *)(alloc.talloc1)->allocBlockSize <
          (undefined8 *)(local_1ab0.super_BuildRecord.depth << 2)) {
        pcVar59 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_1ab0);
      }
      else {
        local_1240._0_8_ = (undefined8 *)(alloc.talloc1)->allocBlockSize;
        pcVar59 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_1240);
        (alloc.talloc1)->ptr = pcVar59;
        sVar44 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
        (alloc.talloc1)->bytesWasted = sVar44;
        (alloc.talloc1)->end = local_1240._0_8_;
        (alloc.talloc1)->cur = local_1ab0.super_BuildRecord.depth;
        if ((ulong)local_1240._0_8_ < local_1ab0.super_BuildRecord.depth) {
          (alloc.talloc1)->cur = 0;
          local_1240._0_8_ = (alloc.talloc1)->allocBlockSize;
          pcVar59 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_1240);
          (alloc.talloc1)->ptr = pcVar59;
          sVar44 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
          (alloc.talloc1)->bytesWasted = sVar44;
          (alloc.talloc1)->end = local_1240._0_8_;
          (alloc.talloc1)->cur = local_1ab0.super_BuildRecord.depth;
          if ((ulong)local_1240._0_8_ < local_1ab0.super_BuildRecord.depth) {
            (alloc.talloc1)->cur = 0;
            pcVar59 = (char *)0x0;
            goto LAB_004fefbf;
          }
        }
        (alloc.talloc1)->bytesWasted = sVar44;
      }
    }
    else {
      (alloc.talloc1)->bytesWasted = (alloc.talloc1)->bytesWasted + uVar43;
      pcVar59 = (alloc.talloc1)->ptr + (uVar52 - local_1ab0.super_BuildRecord.depth);
    }
LAB_004fefbf:
    uVar43 = 7;
    if ((ulong)local_1d50._16_8_ < 7) {
      uVar43 = local_1d50._16_8_;
    }
    local_1c40 = uVar43 | (ulong)pcVar59;
    local_1e70 = _DAT_01f45a30;
    local_1d60 = _DAT_01f45a40;
    local_1e50 = _DAT_01f45a30;
    _local_1d70 = _DAT_01f45a40;
    local_1c38 = uVar57;
    local_1d50._32_8_ = pcVar59;
    pPVar42 = local_1e78;
    pcVar60 = pcVar59;
    for (local_1d50._24_8_ = 0; local_1d50._24_8_ != local_1d50._16_8_;
        local_1d50._24_8_ = local_1d50._24_8_ + 1) {
      local_1d50._40_8_ = ZEXT48(*(uint *)((long)&local_1d20 + local_1d50._24_8_ * 4));
      local_1c30 = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)
                   (((this->createLeaf).scene)->geometries).items[local_1d50._40_8_].ptr;
      uVar52 = 0;
      uVar43 = 0;
      while( true ) {
        uVar4 = local_1d50._24_8_;
        if (uVar43 == uVar57) break;
        if (pPVar42[uVar43].lbounds.bounds0.lower.field_0.m128[3] == (float)local_1d50._40_8_) {
          pSVar11 = (this->createLeaf).sgrids;
          fVar148 = pPVar42[uVar43].lbounds.bounds0.upper.field_0.m128[3];
          uVar5 = pSVar11[(uint)fVar148].sx;
          local_1c28 = uVar43;
          *(uint *)((long)&local_1d90 + uVar52 * 4) = (uint)uVar5;
          uVar6 = pSVar11[(uint)fVar148].sy;
          *(uint *)((long)&local_1cf0.prims + uVar52 * 4) = (uint)uVar6;
          uVar63 = pSVar11[(uint)fVar148].primID;
          *(uint *)(local_1d50 + uVar52 * 4) = uVar63;
          local_1e80 = (ulong)uVar5 & 0x7fff;
          local_1e88 = (BBox1f)((ulong)uVar6 & 0x7fff);
          local_1b30._8_8_ =
               (long)&(*(anon_class_16_2_aeee9775 **)&(&local_1c30->field_1)[7].y)->this +
               (ulong)uVar63 * (long)*(anon_class_16_2_aeee9775 **)(local_1c30->m128 + 0x1a);
          local_1b30._0_8_ = local_1c30;
          local_1b20 = &local_1e80;
          local_1b18 = &local_1e88;
          fVar148 = (&local_1c30->field_1)[3].y;
          fVar143 = (&local_1c30->field_1)[3].z;
          fVar153 = *(float *)&((anon_class_16_2_ed117de8_conflict22 *)(&local_1c30->field_1 + 4))->
                               reduction - fVar143;
          fVar151 = ((float)local_1930._152_4_ - fVar143) / fVar153;
          fVar153 = ((float)local_1930._156_4_ - fVar143) / fVar153;
          fVar152 = fVar148 * fVar153;
          fVar143 = floorf(fVar148 * fVar151);
          fVar147 = ceilf(fVar152);
          iVar47 = (int)fVar143;
          if (fVar143 <= 0.0) {
            fVar143 = 0.0;
          }
          fVar154 = fVar147;
          if (fVar148 <= fVar147) {
            fVar154 = fVar148;
          }
          iVar58 = -1;
          if (-1 < iVar47) {
            iVar58 = iVar47;
          }
          iVar13 = (int)fVar148 + 1;
          if ((int)fVar147 < (int)fVar148 + 1) {
            iVar13 = (int)fVar147;
          }
          GridMesh::linearBounds::anon_class_32_4_e9707c6d::operator()
                    ((BBox3fa *)&local_1240.field_1,(anon_class_32_4_e9707c6d *)&local_1b30.field_1,
                     (long)(int)fVar143);
          GridMesh::linearBounds::anon_class_32_4_e9707c6d::operator()
                    ((BBox3fa *)&local_1840.field_1,(anon_class_32_4_e9707c6d *)&local_1b30.field_1,
                     (long)(int)fVar154);
          fVar147 = fVar148 * fVar151 - fVar143;
          if (iVar13 - iVar58 == 1) {
            if (fVar147 <= 0.0) {
              fVar147 = 0.0;
            }
            fVar148 = 1.0 - fVar147;
            auVar137._0_4_ = fVar148 * local_1240.m128[0] + fVar147 * local_1840.m128[0];
            auVar137._4_4_ = fVar148 * local_1240.m128[1] + fVar147 * local_1840.m128[1];
            auVar137._8_4_ = fVar148 * local_1240.m128[2] + fVar147 * local_1840.m128[2];
            auVar137._12_4_ = fVar148 * local_1240.m128[3] + fVar147 * local_1840.m128[3];
            aVar132._0_4_ =
                 fVar148 * local_1230.super_PrimInfoMB.
                           super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                           field_0.m128[0] + fVar147 * local_1830;
            aVar132._4_4_ =
                 fVar148 * local_1230.super_PrimInfoMB.
                           super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                           field_0.m128[1] + fVar147 * fStack_182c;
            aVar132._8_4_ =
                 fVar148 * local_1230.super_PrimInfoMB.
                           super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                           field_0.m128[2] + fVar147 * fStack_1828;
            aVar132._12_4_ =
                 fVar148 * local_1230.super_PrimInfoMB.
                           super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                           field_0.m128[3] + fVar147 * fStack_1824;
            fVar148 = fVar154 - fVar152;
            if (fVar154 - fVar152 <= 0.0) {
              fVar148 = 0.0;
            }
            fVar143 = 1.0 - fVar148;
            auVar139._0_4_ = local_1840.m128[0] * fVar143 + local_1240.m128[0] * fVar148;
            auVar139._4_4_ = local_1840.m128[1] * fVar143 + local_1240.m128[1] * fVar148;
            auVar139._8_4_ = local_1840.m128[2] * fVar143 + local_1240.m128[2] * fVar148;
            auVar139._12_4_ = local_1840.m128[3] * fVar143 + local_1240.m128[3] * fVar148;
            aVar131._0_4_ =
                 fVar143 * local_1830 +
                 fVar148 * local_1230.super_PrimInfoMB.
                           super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                           field_0.m128[0];
            aVar131._4_4_ =
                 fVar143 * fStack_182c +
                 fVar148 * local_1230.super_PrimInfoMB.
                           super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                           field_0.m128[1];
            aVar131._8_4_ =
                 fVar143 * fStack_1828 +
                 fVar148 * local_1230.super_PrimInfoMB.
                           super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                           field_0.m128[2];
            aVar131._12_4_ =
                 fVar143 * fStack_1824 +
                 fVar148 * local_1230.super_PrimInfoMB.
                           super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                           field_0.m128[3];
            pPVar42 = local_1e78;
            pcVar60 = (char *)local_1d50._32_8_;
          }
          else {
            GridMesh::linearBounds::anon_class_32_4_e9707c6d::operator()
                      ((BBox3fa *)local_1e30,(anon_class_32_4_e9707c6d *)&local_1b30.field_1,
                       (long)((int)fVar143 + 1));
            GridMesh::linearBounds::anon_class_32_4_e9707c6d::operator()
                      ((BBox3fa *)local_1cd0,(anon_class_32_4_e9707c6d *)&local_1b30.field_1,
                       (long)((int)fVar154 + -1));
            pcVar60 = (char *)local_1d50._32_8_;
            pPVar42 = local_1e78;
            if (fVar147 <= 0.0) {
              fVar147 = 0.0;
            }
            fVar143 = 1.0 - fVar147;
            auVar137._0_4_ = local_1240.m128[0] * fVar143 + (float)local_1e30._0_4_ * fVar147;
            auVar137._4_4_ = local_1240.m128[1] * fVar143 + (float)local_1e30._4_4_ * fVar147;
            auVar137._8_4_ = local_1240.m128[2] * fVar143 + (float)(undefined4)uStack_1e28 * fVar147
            ;
            auVar137._12_4_ = local_1240.m128[3] * fVar143 + (float)uStack_1e28._4_4_ * fVar147;
            aVar132._0_4_ =
                 fVar143 * local_1230.super_PrimInfoMB.
                           super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                           field_0.m128[0] + fVar147 * local_1e20.m128[0];
            aVar132._4_4_ =
                 fVar143 * local_1230.super_PrimInfoMB.
                           super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                           field_0.m128[1] + fVar147 * local_1e20.m128[1];
            aVar132._8_4_ =
                 fVar143 * local_1230.super_PrimInfoMB.
                           super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                           field_0.m128[2] + fVar147 * local_1e20.m128[2];
            aVar132._12_4_ =
                 fVar143 * local_1230.super_PrimInfoMB.
                           super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                           field_0.m128[3] + fVar147 * local_1e20.m128[3];
            fVar143 = fVar154 - fVar152;
            if (fVar154 - fVar152 <= 0.0) {
              fVar143 = 0.0;
            }
            fVar147 = 1.0 - fVar143;
            auVar139._0_4_ = local_1840.m128[0] * fVar147 + (float)local_1cd0._0_4_ * fVar143;
            auVar139._4_4_ = local_1840.m128[1] * fVar147 + (float)local_1cd0._4_4_ * fVar143;
            auVar139._8_4_ = local_1840.m128[2] * fVar147 + (float)(undefined4)uStack_1cc8 * fVar143
            ;
            auVar139._12_4_ = local_1840.m128[3] * fVar147 + (float)uStack_1cc8._4_4_ * fVar143;
            aVar131._0_4_ = fVar147 * local_1830 + fVar143 * local_1cc0.m128[0];
            aVar131._4_4_ = fVar147 * fStack_182c + fVar143 * local_1cc0.m128[1];
            aVar131._8_4_ = fVar147 * fStack_1828 + fVar143 * local_1cc0.m128[2];
            aVar131._12_4_ = fVar147 * fStack_1824 + fVar143 * local_1cc0.m128[3];
            if (iVar47 < 0) {
              iVar47 = -1;
            }
            sVar44 = (size_t)iVar47;
            while (sVar44 = sVar44 + 1, (long)sVar44 < (long)iVar13) {
              fVar143 = ((float)(int)sVar44 / fVar148 - fVar151) / (fVar153 - fVar151);
              fVar155 = 1.0 - fVar143;
              fVar147 = auVar139._4_4_;
              fVar152 = auVar139._8_4_;
              fVar154 = auVar139._12_4_;
              fVar95 = auVar137._4_4_;
              fVar68 = auVar137._8_4_;
              fVar69 = auVar137._12_4_;
              fVar70 = aVar131.m128[1];
              fVar123 = aVar131.m128[2];
              fVar135 = aVar131.m128[3];
              fVar136 = aVar132.m128[1];
              fVar133 = aVar132.m128[2];
              fVar134 = aVar132.m128[3];
              GridMesh::linearBounds::anon_class_32_4_e9707c6d::operator()
                        ((BBox3fa *)&local_19c0.field_1,
                         (anon_class_32_4_e9707c6d *)&local_1b30.field_1,sVar44);
              auVar72._0_4_ =
                   local_19c0.m128[0] - (auVar137._0_4_ * fVar155 + auVar139._0_4_ * fVar143);
              auVar72._4_4_ = local_19c0.m128[1] - (fVar95 * fVar155 + fVar147 * fVar143);
              auVar72._8_4_ = local_19c0.m128[2] - (fVar68 * fVar155 + fVar152 * fVar143);
              auVar72._12_4_ = local_19c0.m128[3] - (fVar69 * fVar155 + fVar154 * fVar143);
              auVar97._0_4_ =
                   (float)local_19b0 - (fVar155 * aVar132.m128[0] + fVar143 * aVar131.m128[0]);
              auVar97._4_4_ = local_19b0._4_4_ - (fVar155 * fVar136 + fVar143 * fVar70);
              auVar97._8_4_ = fStack_19a8 - (fVar155 * fVar133 + fVar143 * fVar123);
              auVar97._12_4_ = fStack_19a4 - (fVar155 * fVar134 + fVar143 * fVar135);
              auVar73 = minps(auVar72,ZEXT816(0));
              auVar146 = maxps(auVar97,ZEXT816(0));
              auVar137._0_4_ = auVar137._0_4_ + auVar73._0_4_;
              auVar137._4_4_ = fVar95 + auVar73._4_4_;
              auVar137._8_4_ = fVar68 + auVar73._8_4_;
              auVar137._12_4_ = fVar69 + auVar73._12_4_;
              auVar139._0_4_ = auVar139._0_4_ + auVar73._0_4_;
              auVar139._4_4_ = fVar147 + auVar73._4_4_;
              auVar139._8_4_ = fVar152 + auVar73._8_4_;
              auVar139._12_4_ = fVar154 + auVar73._12_4_;
              aVar132._0_4_ = aVar132.m128[0] + auVar146._0_4_;
              aVar132._4_4_ = fVar136 + auVar146._4_4_;
              aVar132._8_4_ = fVar133 + auVar146._8_4_;
              aVar132._12_4_ = fVar134 + auVar146._12_4_;
              aVar131._0_4_ = aVar131.m128[0] + auVar146._0_4_;
              aVar131._4_4_ = fVar70 + auVar146._4_4_;
              aVar131._8_4_ = fVar123 + auVar146._8_4_;
              aVar131._12_4_ = fVar135 + auVar146._12_4_;
            }
          }
          local_1e70 = minps(local_1e70,auVar137);
          local_1d60 = maxps(local_1d60,(undefined1  [16])aVar132);
          local_1e50 = minps(local_1e50,auVar139);
          _local_1d70 = maxps(_local_1d70,(undefined1  [16])aVar131);
          *(undefined1 (*) [16])(local_1c20 + uVar52 * 0x20) = auVar137;
          local_1c10[uVar52 * 2] = aVar132;
          *(undefined1 (*) [16])(&local_1ab0.super_BuildRecord.depth + uVar52 * 4) = auVar139;
          (&local_1ab0.super_BuildRecord.prims.super_PrimInfoMB.
            super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0)[uVar52].lower.field_0
               = aVar131;
          uVar52 = (ulong)((int)uVar52 + 1);
          uVar43 = local_1c28;
          uVar57 = local_1c38;
        }
        uVar43 = uVar43 + 1;
      }
      for (lVar39 = 0; lVar39 != 4; lVar39 = lVar39 + 1) {
        pcVar2 = pcVar59 + lVar39 * 8;
        pcVar2[0] = '\0';
        pcVar2[1] = '\0';
        pcVar2[2] = '\0';
        pcVar2[3] = '\0';
        pcVar2[4] = -1;
        pcVar2[5] = -1;
        pcVar2[6] = -1;
        pcVar2[7] = -1;
      }
      for (lVar39 = 0x30; lVar39 != 0x34; lVar39 = lVar39 + 1) {
        pcVar59[lVar39] = -1;
        pcVar59[lVar39 + -8] = -1;
        pcVar59[lVar39 + -0x10] = -1;
      }
      for (lVar39 = 0x34; lVar39 != 0x38; lVar39 = lVar39 + 1) {
        pcVar59[lVar39] = '\0';
        pcVar59[lVar39 + -8] = '\0';
        pcVar59[lVar39 + -0x10] = '\0';
      }
      for (lVar39 = 0x60; lVar39 != 100; lVar39 = lVar39 + 1) {
        pcVar59[lVar39] = -1;
        pcVar59[lVar39 + -8] = -1;
        pcVar59[lVar39 + -0x10] = -1;
      }
      for (lVar39 = 100; lVar39 != 0x68; lVar39 = lVar39 + 1) {
        pcVar59[lVar39] = '\0';
        pcVar59[lVar39 + -8] = '\0';
        pcVar59[lVar39 + -0x10] = '\0';
      }
      *(float *)(pcVar60 + local_1d50._24_8_ * 0x90 + 0x88) = (float)local_1d50._40_8_;
      *(undefined4 *)(pcVar60 + local_1d50._24_8_ * 0x90 + 0x80) = local_1930._152_4_;
      *(float *)(pcVar60 + local_1d50._24_8_ * 0x90 + 0x84) =
           1.0 / ((float)local_1930._156_4_ - (float)local_1930._152_4_);
      local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
      field_0._0_8_ = 0x7f8000007f800000;
      local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
      field_0._8_8_ = 0x7f8000007f800000;
      local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
      upper.field_0._0_8_ = 0x7f8000007f800000;
      local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
      upper.field_0._8_8_ = 0x7f8000007f800000;
      local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
      upper.field_0._0_8_ = 0x7f8000007f800000;
      local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
      upper.field_0._8_8_ = 0x7f8000007f800000;
      local_1230.super_PrimInfoMB.object_range._begin = 0xff800000ff800000;
      local_1230.super_PrimInfoMB.object_range._end = 0xff800000ff800000;
      local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
      field_0._0_8_ = 0xff800000ff800000;
      local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
      field_0._8_8_ = 0xff800000ff800000;
      local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
      lower.field_0._0_8_ = 0xff800000ff800000;
      local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
      lower.field_0._8_8_ = 0xff800000ff800000;
      for (lVar39 = 0; lVar39 != 4; lVar39 = lVar39 + 1) {
        *(undefined8 *)((long)&local_1240 + lVar39 * 8) = 8;
      }
      local_17e0 = 0x7f8000007f800000;
      uStack_17d8 = 0x7f8000007f800000;
      local_1800 = 0x7f8000007f800000;
      uStack_17f8 = 0x7f8000007f800000;
      local_1820._0_8_ = 0x7f8000007f800000;
      local_1820._8_8_ = 0x7f8000007f800000;
      local_17d0 = 0xff800000ff800000;
      uStack_17c8 = 0xff800000ff800000;
      local_17f0 = 0xff800000ff800000;
      uStack_17e8 = 0xff800000ff800000;
      local_1810._0_8_ = 0xff800000ff800000;
      local_1810._8_8_ = 0xff800000ff800000;
      for (lVar39 = 0; lVar39 != 4; lVar39 = lVar39 + 1) {
        *(undefined8 *)((long)&local_1840 + lVar39 * 8) = 8;
      }
      for (lVar39 = 0; uVar52 << 2 != lVar39; lVar39 = lVar39 + 4) {
        *(ulong *)(pcVar59 + lVar39 * 2) =
             CONCAT44(*(undefined4 *)(local_1d50 + lVar39),
                      *(int *)((long)&local_1cf0.prims + lVar39) << 0x10 |
                      (uint)*(ushort *)((long)&local_1d90 + lVar39));
        uVar3 = *(undefined4 *)(local_1c20 + lVar39 * 8 + 4);
        *(undefined4 *)(local_1190 + lVar39 + -0x90) = *(undefined4 *)(local_1c20 + lVar39 * 8);
        *(undefined4 *)(local_1190 + lVar39 + -0x70) = uVar3;
        *(undefined4 *)(local_1190 + lVar39 + -0x50) = *(undefined4 *)(local_1c20 + lVar39 * 8 + 8);
        *(undefined4 *)(local_1190 + lVar39 + -0x80) =
             *(undefined4 *)((long)local_1c10 + lVar39 * 8);
        *(undefined4 *)(local_1190 + lVar39 + -0x60) =
             *(undefined4 *)((long)local_1c10 + lVar39 * 8 + 4);
        *(undefined4 *)(local_1190 + lVar39 + -0x40) =
             *(undefined4 *)((long)local_1c10 + lVar39 * 8 + 8);
        uVar3 = *(undefined4 *)((long)&local_1ab0.super_BuildRecord.depth + lVar39 * 8 + 4);
        *(int *)((long)&local_1820 + lVar39) = (int)(&local_1ab0.super_BuildRecord.depth)[lVar39];
        *(undefined4 *)((long)&local_1800 + lVar39) = uVar3;
        *(undefined4 *)((long)&local_17e0 + lVar39) =
             *(undefined4 *)(&local_1ab0.super_BuildRecord.field_0x8 + lVar39 * 8);
        *(undefined4 *)((long)&local_1810 + lVar39) =
             *(undefined4 *)
              ((long)&local_1ab0.super_BuildRecord.prims.super_PrimInfoMB.
                      super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                      field_0 + lVar39 * 8);
        *(undefined4 *)((long)&local_17f0 + lVar39) =
             *(undefined4 *)
              ((long)&local_1ab0.super_BuildRecord.prims.super_PrimInfoMB.
                      super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                      field_0 + lVar39 * 8 + 4);
        *(undefined4 *)((long)&local_17d0 + lVar39) =
             *(undefined4 *)
              ((long)&local_1ab0.super_BuildRecord.prims.super_PrimInfoMB.
                      super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                      field_0 + lVar39 * 8 + 8);
      }
      auVar28._8_8_ =
           local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds0.upper.field_0._8_8_;
      auVar28._0_8_ =
           local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds0.upper.field_0._0_8_;
      fVar151 = (float)local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                       geomBounds.bounds0.upper.field_0._0_8_;
      fVar152 = (float)((ulong)local_1230.super_PrimInfoMB.
                               super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                               upper.field_0._0_8_ >> 0x20);
      fVar154 = (float)local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                       geomBounds.bounds0.upper.field_0._8_8_;
      fVar155 = (float)((ulong)local_1230.super_PrimInfoMB.
                               super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                               upper.field_0._8_8_ >> 0x20);
      auVar29._8_8_ =
           local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds1.lower.field_0._8_8_;
      auVar29._0_8_ =
           local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds1.lower.field_0._0_8_;
      fVar148 = (float)local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                       geomBounds.bounds1.lower.field_0._0_8_;
      fVar143 = (float)((ulong)local_1230.super_PrimInfoMB.
                               super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                               lower.field_0._0_8_ >> 0x20);
      fVar147 = (float)local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                       geomBounds.bounds1.lower.field_0._8_8_;
      fVar153 = (float)((ulong)local_1230.super_PrimInfoMB.
                               super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                               lower.field_0._8_8_ >> 0x20);
      uVar63 = -(uint)(fVar151 != INFINITY);
      uVar65 = -(uint)(fVar152 != INFINITY);
      uVar66 = -(uint)(fVar154 != INFINITY);
      uVar67 = -(uint)(fVar155 != INFINITY);
      auVar74._4_4_ = fVar151;
      auVar74._0_4_ = fVar152;
      auVar74._8_4_ = fVar155;
      auVar74._12_4_ = fVar154;
      auVar73 = minps(auVar74,auVar28);
      auVar124._0_8_ = auVar73._8_8_;
      auVar124._8_4_ = auVar73._0_4_;
      auVar124._12_4_ = auVar73._4_4_;
      auVar146 = minps(auVar124,auVar73);
      auVar75._4_4_ = fVar148;
      auVar75._0_4_ = fVar143;
      auVar75._8_4_ = fVar153;
      auVar75._12_4_ = fVar147;
      auVar73 = maxps(auVar75,auVar29);
      auVar14._4_8_ =
           local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds1.lower.field_0._8_8_;
      auVar14._0_4_ = auVar73._4_4_;
      auVar98._0_8_ = auVar14._0_8_ << 0x20;
      auVar98._8_4_ = auVar73._8_4_;
      auVar98._12_4_ = auVar73._12_4_;
      uVar120 = auVar98._8_8_;
      auVar99._8_8_ = auVar73._8_8_;
      auVar99._0_8_ = uVar120;
      if (auVar73._8_4_ <= auVar73._0_4_) {
        auVar100._4_12_ = auVar99._4_12_;
        auVar100._0_4_ = auVar73._0_4_;
        uVar120 = auVar100._0_8_;
      }
      fVar123 = auVar146._0_4_;
      fVar95 = ((float)uVar120 - fVar123) * 1.0000002;
      uVar64 = -(uint)(fVar95 / 255.0 == 0.0);
      local_1ef0 = (float)(uVar64 & 0x1000000 | ~uVar64 & (uint)(fVar95 / 255.0));
      fVar135 = (float)(-(uint)(0.0 < fVar95) & (uint)(255.0 / fVar95));
      fVar95 = floorf((fVar154 - fVar123) * fVar135);
      fVar68 = floorf((fVar155 - fVar123) * fVar135);
      fVar69 = floorf((fVar151 - fVar123) * fVar135);
      fVar70 = floorf((fVar152 - fVar123) * fVar135);
      uVar96 = ~((int)fVar69 >> 0x1f) & (int)fVar69;
      uVar118 = ~((int)fVar70 >> 0x1f) & (int)fVar70;
      uVar119 = ~((int)fVar95 >> 0x1f) & (int)fVar95;
      uVar121 = ~((int)fVar68 >> 0x1f) & (int)fVar68;
      fVar95 = ceilf((fVar147 - fVar123) * fVar135);
      fVar68 = ceilf((fVar153 - fVar123) * fVar135);
      fVar69 = ceilf((fVar148 - fVar123) * fVar135);
      fVar70 = ceilf((fVar143 - fVar123) * fVar135);
      uVar64 = -(uint)(0xfe < (int)fVar69);
      uVar89 = -(uint)(0xfe < (int)fVar70);
      uVar91 = -(uint)(0xfe < (int)fVar95);
      uVar93 = -(uint)(0xfe < (int)fVar68);
      uVar71 = uVar64 & 0xff | ~uVar64 & (int)fVar69;
      uVar90 = uVar89 & 0xff | ~uVar89 & (int)fVar70;
      uVar92 = uVar91 & 0xff | ~uVar91 & (int)fVar95;
      uVar94 = uVar93 & 0xff | ~uVar93 & (int)fVar68;
      uVar64 = -(uint)((float)(int)uVar96 * local_1ef0 + fVar123 <= fVar151);
      uVar89 = -(uint)((float)(int)uVar118 * local_1ef0 + fVar123 <= fVar152);
      uVar91 = -(uint)((float)(int)uVar119 * local_1ef0 + fVar123 <= fVar154);
      uVar93 = -(uint)((float)(int)uVar121 * local_1ef0 + fVar123 <= fVar155);
      uVar96 = ~uVar64 & uVar96 - 1 | uVar96 & uVar64;
      uVar118 = ~uVar89 & uVar118 - 1 | uVar118 & uVar89;
      uVar119 = ~uVar91 & uVar119 - 1 | uVar119 & uVar91;
      uVar121 = ~uVar93 & uVar121 - 1 | uVar121 & uVar93;
      uVar64 = -(uint)(fVar148 <= (float)(int)uVar71 * local_1ef0 + fVar123);
      uVar89 = -(uint)(fVar143 <= (float)(int)uVar90 * local_1ef0 + fVar123);
      uVar91 = -(uint)(fVar147 <= (float)(int)uVar92 * local_1ef0 + fVar123);
      uVar93 = -(uint)(fVar153 <= (float)(int)uVar94 * local_1ef0 + fVar123);
      uVar71 = ~uVar64 & uVar71 + 1 | uVar71 & uVar64;
      uVar90 = ~uVar89 & uVar90 + 1 | uVar90 & uVar89;
      uVar92 = ~uVar91 & uVar92 + 1 | uVar92 & uVar91;
      uVar94 = ~uVar93 & uVar94 + 1 | uVar94 & uVar93;
      uVar64 = -(uint)(0xfe < (int)uVar71);
      uVar89 = -(uint)(0xfe < (int)uVar90);
      uVar91 = -(uint)(0xfe < (int)uVar92);
      uVar93 = -(uint)(0xfe < (int)uVar94);
      local_1e30._4_4_ = ~uVar65 & 0xff | ~((int)uVar118 >> 0x1f) & uVar118 & uVar65;
      local_1e30._0_4_ = ~uVar63 & 0xff | ~((int)uVar96 >> 0x1f) & uVar96 & uVar63;
      uStack_1e28._0_4_ = ~uVar66 & 0xff | ~((int)uVar119 >> 0x1f) & uVar119 & uVar66;
      uStack_1e28._4_4_ = ~uVar67 & 0xff | ~((int)uVar121 >> 0x1f) & uVar121 & uVar67;
      local_1cd0._4_4_ = (uVar89 & 0xff | ~uVar89 & uVar90) & uVar65;
      local_1cd0._0_4_ = (uVar64 & 0xff | ~uVar64 & uVar71) & uVar63;
      uStack_1cc8._0_4_ = (uVar91 & 0xff | ~uVar91 & uVar92) & uVar66;
      uStack_1cc8._4_4_ = (uVar93 & 0xff | ~uVar93 & uVar94) & uVar67;
      for (lVar39 = 0; lVar39 != 4; lVar39 = lVar39 + 1) {
        pcVar59[lVar39 + 0x20] = local_1e30[lVar39 * 4];
      }
      for (lVar39 = 0; lVar39 != 4; lVar39 = lVar39 + 1) {
        pcVar59[lVar39 + 0x24] = local_1cd0[lVar39 * 4];
      }
      *(float *)(pcVar60 + uVar4 * 0x90 + 0x38) = fVar123;
      *(float *)(pcVar60 + uVar4 * 0x90 + 0x44) = local_1ef0;
      auVar30._8_8_ =
           local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds1.upper.field_0._8_8_;
      auVar30._0_8_ =
           local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds1.upper.field_0._0_8_;
      fVar151 = (float)local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                       geomBounds.bounds1.upper.field_0._0_8_;
      fVar152 = (float)((ulong)local_1230.super_PrimInfoMB.
                               super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                               upper.field_0._0_8_ >> 0x20);
      fVar154 = (float)local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                       geomBounds.bounds1.upper.field_0._8_8_;
      fVar155 = (float)((ulong)local_1230.super_PrimInfoMB.
                               super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                               upper.field_0._8_8_ >> 0x20);
      auVar31._8_8_ =
           local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
           lower.field_0._8_8_;
      auVar31._0_8_ =
           local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
           lower.field_0._0_8_;
      fVar148 = (float)local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                       centBounds.lower.field_0._0_8_;
      fVar143 = (float)((ulong)local_1230.super_PrimInfoMB.
                               super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                               field_0._0_8_ >> 0x20);
      fVar147 = (float)local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                       centBounds.lower.field_0._8_8_;
      fVar153 = (float)((ulong)local_1230.super_PrimInfoMB.
                               super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                               field_0._8_8_ >> 0x20);
      uVar63 = -(uint)(fVar151 != INFINITY);
      uVar65 = -(uint)(fVar152 != INFINITY);
      uVar66 = -(uint)(fVar154 != INFINITY);
      uVar67 = -(uint)(fVar155 != INFINITY);
      auVar76._4_4_ = fVar151;
      auVar76._0_4_ = fVar152;
      auVar76._8_4_ = fVar155;
      auVar76._12_4_ = fVar154;
      auVar73 = minps(auVar76,auVar30);
      auVar125._0_8_ = auVar73._8_8_;
      auVar125._8_4_ = auVar73._0_4_;
      auVar125._12_4_ = auVar73._4_4_;
      auVar146 = minps(auVar125,auVar73);
      auVar77._4_4_ = fVar148;
      auVar77._0_4_ = fVar143;
      auVar77._8_4_ = fVar153;
      auVar77._12_4_ = fVar147;
      auVar73 = maxps(auVar77,auVar31);
      auVar15._4_8_ =
           local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
           lower.field_0._8_8_;
      auVar15._0_4_ = auVar73._4_4_;
      auVar101._0_8_ = auVar15._0_8_ << 0x20;
      auVar101._8_4_ = auVar73._8_4_;
      auVar101._12_4_ = auVar73._12_4_;
      uVar120 = auVar101._8_8_;
      auVar102._8_8_ = auVar73._8_8_;
      auVar102._0_8_ = uVar120;
      if (auVar73._8_4_ <= auVar73._0_4_) {
        auVar103._4_12_ = auVar102._4_12_;
        auVar103._0_4_ = auVar73._0_4_;
        uVar120 = auVar103._0_8_;
      }
      fVar123 = auVar146._0_4_;
      fVar95 = ((float)uVar120 - fVar123) * 1.0000002;
      uVar64 = -(uint)(fVar95 / 255.0 == 0.0);
      local_1ef0 = (float)(uVar64 & 0x1000000 | ~uVar64 & (uint)(fVar95 / 255.0));
      fVar135 = (float)(-(uint)(0.0 < fVar95) & (uint)(255.0 / fVar95));
      fVar95 = floorf((fVar154 - fVar123) * fVar135);
      fVar68 = floorf((fVar155 - fVar123) * fVar135);
      fVar69 = floorf((fVar151 - fVar123) * fVar135);
      fVar70 = floorf((fVar152 - fVar123) * fVar135);
      uVar96 = ~((int)fVar69 >> 0x1f) & (int)fVar69;
      uVar118 = ~((int)fVar70 >> 0x1f) & (int)fVar70;
      uVar119 = ~((int)fVar95 >> 0x1f) & (int)fVar95;
      uVar121 = ~((int)fVar68 >> 0x1f) & (int)fVar68;
      fVar95 = ceilf((fVar147 - fVar123) * fVar135);
      fVar68 = ceilf((fVar153 - fVar123) * fVar135);
      fVar69 = ceilf((fVar148 - fVar123) * fVar135);
      fVar70 = ceilf((fVar143 - fVar123) * fVar135);
      uVar64 = -(uint)(0xfe < (int)fVar69);
      uVar89 = -(uint)(0xfe < (int)fVar70);
      uVar91 = -(uint)(0xfe < (int)fVar95);
      uVar93 = -(uint)(0xfe < (int)fVar68);
      uVar71 = uVar64 & 0xff | ~uVar64 & (int)fVar69;
      uVar90 = uVar89 & 0xff | ~uVar89 & (int)fVar70;
      uVar92 = uVar91 & 0xff | ~uVar91 & (int)fVar95;
      uVar94 = uVar93 & 0xff | ~uVar93 & (int)fVar68;
      uVar64 = -(uint)((float)(int)uVar96 * local_1ef0 + fVar123 <= fVar151);
      uVar89 = -(uint)((float)(int)uVar118 * local_1ef0 + fVar123 <= fVar152);
      uVar91 = -(uint)((float)(int)uVar119 * local_1ef0 + fVar123 <= fVar154);
      uVar93 = -(uint)((float)(int)uVar121 * local_1ef0 + fVar123 <= fVar155);
      uVar96 = ~uVar64 & uVar96 - 1 | uVar96 & uVar64;
      uVar118 = ~uVar89 & uVar118 - 1 | uVar118 & uVar89;
      uVar119 = ~uVar91 & uVar119 - 1 | uVar119 & uVar91;
      uVar121 = ~uVar93 & uVar121 - 1 | uVar121 & uVar93;
      uVar64 = -(uint)(fVar148 <= (float)(int)uVar71 * local_1ef0 + fVar123);
      uVar89 = -(uint)(fVar143 <= (float)(int)uVar90 * local_1ef0 + fVar123);
      uVar91 = -(uint)(fVar147 <= (float)(int)uVar92 * local_1ef0 + fVar123);
      uVar93 = -(uint)(fVar153 <= (float)(int)uVar94 * local_1ef0 + fVar123);
      uVar71 = ~uVar64 & uVar71 + 1 | uVar71 & uVar64;
      uVar90 = ~uVar89 & uVar90 + 1 | uVar90 & uVar89;
      uVar92 = ~uVar91 & uVar92 + 1 | uVar92 & uVar91;
      uVar94 = ~uVar93 & uVar94 + 1 | uVar94 & uVar93;
      uVar64 = -(uint)(0xfe < (int)uVar71);
      uVar89 = -(uint)(0xfe < (int)uVar90);
      uVar91 = -(uint)(0xfe < (int)uVar92);
      uVar93 = -(uint)(0xfe < (int)uVar94);
      local_1e30._4_4_ = ~uVar65 & 0xff | ~((int)uVar118 >> 0x1f) & uVar118 & uVar65;
      local_1e30._0_4_ = ~uVar63 & 0xff | ~((int)uVar96 >> 0x1f) & uVar96 & uVar63;
      uStack_1e28._0_4_ = ~uVar66 & 0xff | ~((int)uVar119 >> 0x1f) & uVar119 & uVar66;
      uStack_1e28._4_4_ = ~uVar67 & 0xff | ~((int)uVar121 >> 0x1f) & uVar121 & uVar67;
      local_1cd0._4_4_ = (uVar89 & 0xff | ~uVar89 & uVar90) & uVar65;
      local_1cd0._0_4_ = (uVar64 & 0xff | ~uVar64 & uVar71) & uVar63;
      uStack_1cc8._0_4_ = (uVar91 & 0xff | ~uVar91 & uVar92) & uVar66;
      uStack_1cc8._4_4_ = (uVar93 & 0xff | ~uVar93 & uVar94) & uVar67;
      for (lVar39 = 0; lVar39 != 4; lVar39 = lVar39 + 1) {
        pcVar59[lVar39 + 0x28] = local_1e30[lVar39 * 4];
      }
      for (lVar39 = 0; lVar39 != 4; lVar39 = lVar39 + 1) {
        pcVar59[lVar39 + 0x2c] = local_1cd0[lVar39 * 4];
      }
      *(float *)(pcVar60 + uVar4 * 0x90 + 0x3c) = fVar123;
      *(float *)(pcVar60 + uVar4 * 0x90 + 0x48) = local_1ef0;
      auVar32._8_8_ =
           local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
           upper.field_0._8_8_;
      auVar32._0_8_ =
           local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
           upper.field_0._0_8_;
      fVar151 = (float)local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                       centBounds.upper.field_0._0_8_;
      fVar152 = (float)((ulong)local_1230.super_PrimInfoMB.
                               super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                               field_0._0_8_ >> 0x20);
      fVar154 = (float)local_1230.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                       centBounds.upper.field_0._8_8_;
      fVar155 = (float)((ulong)local_1230.super_PrimInfoMB.
                               super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                               field_0._8_8_ >> 0x20);
      auVar33._8_8_ = local_1230.super_PrimInfoMB.object_range._end;
      auVar33._0_8_ = local_1230.super_PrimInfoMB.object_range._begin;
      fVar148 = (float)local_1230.super_PrimInfoMB.object_range._begin;
      fVar143 = (float)(local_1230.super_PrimInfoMB.object_range._begin >> 0x20);
      fVar147 = (float)local_1230.super_PrimInfoMB.object_range._end;
      fVar153 = (float)(local_1230.super_PrimInfoMB.object_range._end >> 0x20);
      uVar63 = -(uint)(fVar151 != INFINITY);
      uVar65 = -(uint)(fVar152 != INFINITY);
      uVar66 = -(uint)(fVar154 != INFINITY);
      uVar67 = -(uint)(fVar155 != INFINITY);
      auVar78._4_4_ = fVar151;
      auVar78._0_4_ = fVar152;
      auVar78._8_4_ = fVar155;
      auVar78._12_4_ = fVar154;
      auVar73 = minps(auVar78,auVar32);
      auVar126._0_8_ = auVar73._8_8_;
      auVar126._8_4_ = auVar73._0_4_;
      auVar126._12_4_ = auVar73._4_4_;
      auVar146 = minps(auVar126,auVar73);
      auVar79._4_4_ = fVar148;
      auVar79._0_4_ = fVar143;
      auVar79._8_4_ = fVar153;
      auVar79._12_4_ = fVar147;
      auVar73 = maxps(auVar79,auVar33);
      auVar16._4_8_ = local_1230.super_PrimInfoMB.object_range._end;
      auVar16._0_4_ = auVar73._4_4_;
      auVar104._0_8_ = auVar16._0_8_ << 0x20;
      auVar104._8_4_ = auVar73._8_4_;
      auVar104._12_4_ = auVar73._12_4_;
      uVar120 = auVar104._8_8_;
      auVar105._8_8_ = auVar73._8_8_;
      auVar105._0_8_ = uVar120;
      if (auVar73._8_4_ <= auVar73._0_4_) {
        auVar106._4_12_ = auVar105._4_12_;
        auVar106._0_4_ = auVar73._0_4_;
        uVar120 = auVar106._0_8_;
      }
      fVar123 = auVar146._0_4_;
      fVar95 = ((float)uVar120 - fVar123) * 1.0000002;
      uVar64 = -(uint)(fVar95 / 255.0 == 0.0);
      local_1ef0 = (float)(uVar64 & 0x1000000 | ~uVar64 & (uint)(fVar95 / 255.0));
      fVar135 = (float)(-(uint)(0.0 < fVar95) & (uint)(255.0 / fVar95));
      fVar95 = floorf((fVar154 - fVar123) * fVar135);
      fVar68 = floorf((fVar155 - fVar123) * fVar135);
      fVar69 = floorf((fVar151 - fVar123) * fVar135);
      fVar70 = floorf((fVar152 - fVar123) * fVar135);
      uVar96 = ~((int)fVar69 >> 0x1f) & (int)fVar69;
      uVar118 = ~((int)fVar70 >> 0x1f) & (int)fVar70;
      uVar119 = ~((int)fVar95 >> 0x1f) & (int)fVar95;
      uVar121 = ~((int)fVar68 >> 0x1f) & (int)fVar68;
      fVar95 = ceilf((fVar147 - fVar123) * fVar135);
      fVar68 = ceilf((fVar153 - fVar123) * fVar135);
      fVar69 = ceilf((fVar148 - fVar123) * fVar135);
      fVar70 = ceilf((fVar143 - fVar123) * fVar135);
      uVar64 = -(uint)(0xfe < (int)fVar69);
      uVar89 = -(uint)(0xfe < (int)fVar70);
      uVar91 = -(uint)(0xfe < (int)fVar95);
      uVar93 = -(uint)(0xfe < (int)fVar68);
      uVar71 = uVar64 & 0xff | ~uVar64 & (int)fVar69;
      uVar90 = uVar89 & 0xff | ~uVar89 & (int)fVar70;
      uVar92 = uVar91 & 0xff | ~uVar91 & (int)fVar95;
      uVar94 = uVar93 & 0xff | ~uVar93 & (int)fVar68;
      uVar64 = -(uint)((float)(int)uVar96 * local_1ef0 + fVar123 <= fVar151);
      uVar89 = -(uint)((float)(int)uVar118 * local_1ef0 + fVar123 <= fVar152);
      uVar91 = -(uint)((float)(int)uVar119 * local_1ef0 + fVar123 <= fVar154);
      uVar93 = -(uint)((float)(int)uVar121 * local_1ef0 + fVar123 <= fVar155);
      uVar96 = ~uVar64 & uVar96 - 1 | uVar96 & uVar64;
      uVar118 = ~uVar89 & uVar118 - 1 | uVar118 & uVar89;
      uVar119 = ~uVar91 & uVar119 - 1 | uVar119 & uVar91;
      uVar121 = ~uVar93 & uVar121 - 1 | uVar121 & uVar93;
      uVar64 = -(uint)(fVar148 <= (float)(int)uVar71 * local_1ef0 + fVar123);
      uVar89 = -(uint)(fVar143 <= (float)(int)uVar90 * local_1ef0 + fVar123);
      uVar91 = -(uint)(fVar147 <= (float)(int)uVar92 * local_1ef0 + fVar123);
      uVar93 = -(uint)(fVar153 <= (float)(int)uVar94 * local_1ef0 + fVar123);
      uVar71 = ~uVar64 & uVar71 + 1 | uVar71 & uVar64;
      uVar90 = ~uVar89 & uVar90 + 1 | uVar90 & uVar89;
      uVar92 = ~uVar91 & uVar92 + 1 | uVar92 & uVar91;
      uVar94 = ~uVar93 & uVar94 + 1 | uVar94 & uVar93;
      uVar64 = -(uint)(0xfe < (int)uVar71);
      uVar89 = -(uint)(0xfe < (int)uVar90);
      uVar91 = -(uint)(0xfe < (int)uVar92);
      uVar93 = -(uint)(0xfe < (int)uVar94);
      local_1e30._4_4_ = ~uVar65 & 0xff | ~((int)uVar118 >> 0x1f) & uVar118 & uVar65;
      local_1e30._0_4_ = ~uVar63 & 0xff | ~((int)uVar96 >> 0x1f) & uVar96 & uVar63;
      uStack_1e28._0_4_ = ~uVar66 & 0xff | ~((int)uVar119 >> 0x1f) & uVar119 & uVar66;
      uStack_1e28._4_4_ = ~uVar67 & 0xff | ~((int)uVar121 >> 0x1f) & uVar121 & uVar67;
      local_1cd0._4_4_ = (uVar89 & 0xff | ~uVar89 & uVar90) & uVar65;
      local_1cd0._0_4_ = (uVar64 & 0xff | ~uVar64 & uVar71) & uVar63;
      uStack_1cc8._0_4_ = (uVar91 & 0xff | ~uVar91 & uVar92) & uVar66;
      uStack_1cc8._4_4_ = (uVar93 & 0xff | ~uVar93 & uVar94) & uVar67;
      for (lVar39 = 0; lVar39 != 4; lVar39 = lVar39 + 1) {
        pcVar59[lVar39 + 0x30] = local_1e30[lVar39 * 4];
      }
      for (lVar39 = 0; lVar39 != 4; lVar39 = lVar39 + 1) {
        pcVar59[lVar39 + 0x34] = local_1cd0[lVar39 * 4];
      }
      *(float *)(pcVar60 + uVar4 * 0x90 + 0x40) = fVar123;
      *(float *)(pcVar60 + uVar4 * 0x90 + 0x4c) = local_1ef0;
      auVar22._8_8_ = local_1820._8_8_;
      auVar22._0_8_ = local_1820._0_8_;
      fVar151 = (float)local_1820._0_8_;
      fVar152 = (float)((ulong)local_1820._0_8_ >> 0x20);
      fVar154 = (float)local_1820._8_8_;
      fVar155 = (float)((ulong)local_1820._8_8_ >> 0x20);
      auVar23._8_8_ = local_1810._8_8_;
      auVar23._0_8_ = local_1810._0_8_;
      fVar148 = (float)local_1810._0_8_;
      fVar143 = (float)((ulong)local_1810._0_8_ >> 0x20);
      fVar147 = (float)local_1810._8_8_;
      fVar153 = (float)((ulong)local_1810._8_8_ >> 0x20);
      uVar63 = -(uint)(fVar151 != INFINITY);
      uVar65 = -(uint)(fVar152 != INFINITY);
      uVar66 = -(uint)(fVar154 != INFINITY);
      uVar67 = -(uint)(fVar155 != INFINITY);
      auVar80._4_4_ = fVar151;
      auVar80._0_4_ = fVar152;
      auVar80._8_4_ = fVar155;
      auVar80._12_4_ = fVar154;
      auVar73 = minps(auVar80,auVar22);
      auVar127._0_8_ = auVar73._8_8_;
      auVar127._8_4_ = auVar73._0_4_;
      auVar127._12_4_ = auVar73._4_4_;
      auVar146 = minps(auVar127,auVar73);
      auVar81._4_4_ = fVar148;
      auVar81._0_4_ = fVar143;
      auVar81._8_4_ = fVar153;
      auVar81._12_4_ = fVar147;
      auVar73 = maxps(auVar81,auVar23);
      auVar17._4_8_ = local_1810._8_8_;
      auVar17._0_4_ = auVar73._4_4_;
      auVar107._0_8_ = auVar17._0_8_ << 0x20;
      auVar107._8_4_ = auVar73._8_4_;
      auVar107._12_4_ = auVar73._12_4_;
      uVar120 = auVar107._8_8_;
      auVar108._8_8_ = auVar73._8_8_;
      auVar108._0_8_ = uVar120;
      if (auVar73._8_4_ <= auVar73._0_4_) {
        auVar109._4_12_ = auVar108._4_12_;
        auVar109._0_4_ = auVar73._0_4_;
        uVar120 = auVar109._0_8_;
      }
      fVar123 = auVar146._0_4_;
      fVar95 = ((float)uVar120 - fVar123) * 1.0000002;
      uVar64 = -(uint)(fVar95 / 255.0 == 0.0);
      local_1ef0 = (float)(uVar64 & 0x1000000 | ~uVar64 & (uint)(fVar95 / 255.0));
      fVar135 = (float)(-(uint)(0.0 < fVar95) & (uint)(255.0 / fVar95));
      fVar95 = floorf((fVar154 - fVar123) * fVar135);
      fVar68 = floorf((fVar155 - fVar123) * fVar135);
      fVar69 = floorf((fVar151 - fVar123) * fVar135);
      fVar70 = floorf((fVar152 - fVar123) * fVar135);
      uVar96 = ~((int)fVar69 >> 0x1f) & (int)fVar69;
      uVar118 = ~((int)fVar70 >> 0x1f) & (int)fVar70;
      uVar119 = ~((int)fVar95 >> 0x1f) & (int)fVar95;
      uVar121 = ~((int)fVar68 >> 0x1f) & (int)fVar68;
      fVar95 = ceilf((fVar147 - fVar123) * fVar135);
      fVar68 = ceilf((fVar153 - fVar123) * fVar135);
      fVar69 = ceilf((fVar148 - fVar123) * fVar135);
      fVar70 = ceilf((fVar143 - fVar123) * fVar135);
      uVar64 = -(uint)(0xfe < (int)fVar69);
      uVar89 = -(uint)(0xfe < (int)fVar70);
      uVar91 = -(uint)(0xfe < (int)fVar95);
      uVar93 = -(uint)(0xfe < (int)fVar68);
      uVar71 = uVar64 & 0xff | ~uVar64 & (int)fVar69;
      uVar90 = uVar89 & 0xff | ~uVar89 & (int)fVar70;
      uVar92 = uVar91 & 0xff | ~uVar91 & (int)fVar95;
      uVar94 = uVar93 & 0xff | ~uVar93 & (int)fVar68;
      uVar64 = -(uint)((float)(int)uVar96 * local_1ef0 + fVar123 <= fVar151);
      uVar89 = -(uint)((float)(int)uVar118 * local_1ef0 + fVar123 <= fVar152);
      uVar91 = -(uint)((float)(int)uVar119 * local_1ef0 + fVar123 <= fVar154);
      uVar93 = -(uint)((float)(int)uVar121 * local_1ef0 + fVar123 <= fVar155);
      uVar96 = ~uVar64 & uVar96 - 1 | uVar96 & uVar64;
      uVar118 = ~uVar89 & uVar118 - 1 | uVar118 & uVar89;
      uVar119 = ~uVar91 & uVar119 - 1 | uVar119 & uVar91;
      uVar121 = ~uVar93 & uVar121 - 1 | uVar121 & uVar93;
      uVar64 = -(uint)(fVar148 <= (float)(int)uVar71 * local_1ef0 + fVar123);
      uVar89 = -(uint)(fVar143 <= (float)(int)uVar90 * local_1ef0 + fVar123);
      uVar91 = -(uint)(fVar147 <= (float)(int)uVar92 * local_1ef0 + fVar123);
      uVar93 = -(uint)(fVar153 <= (float)(int)uVar94 * local_1ef0 + fVar123);
      uVar71 = ~uVar64 & uVar71 + 1 | uVar71 & uVar64;
      uVar90 = ~uVar89 & uVar90 + 1 | uVar90 & uVar89;
      uVar92 = ~uVar91 & uVar92 + 1 | uVar92 & uVar91;
      uVar94 = ~uVar93 & uVar94 + 1 | uVar94 & uVar93;
      uVar64 = -(uint)(0xfe < (int)uVar71);
      uVar89 = -(uint)(0xfe < (int)uVar90);
      uVar91 = -(uint)(0xfe < (int)uVar92);
      uVar93 = -(uint)(0xfe < (int)uVar94);
      local_1e30._4_4_ = ~uVar65 & 0xff | ~((int)uVar118 >> 0x1f) & uVar118 & uVar65;
      local_1e30._0_4_ = ~uVar63 & 0xff | ~((int)uVar96 >> 0x1f) & uVar96 & uVar63;
      uStack_1e28._0_4_ = ~uVar66 & 0xff | ~((int)uVar119 >> 0x1f) & uVar119 & uVar66;
      uStack_1e28._4_4_ = ~uVar67 & 0xff | ~((int)uVar121 >> 0x1f) & uVar121 & uVar67;
      local_1cd0._4_4_ = (uVar89 & 0xff | ~uVar89 & uVar90) & uVar65;
      local_1cd0._0_4_ = (uVar64 & 0xff | ~uVar64 & uVar71) & uVar63;
      uStack_1cc8._0_4_ = (uVar91 & 0xff | ~uVar91 & uVar92) & uVar66;
      uStack_1cc8._4_4_ = (uVar93 & 0xff | ~uVar93 & uVar94) & uVar67;
      for (lVar39 = 0; lVar39 != 4; lVar39 = lVar39 + 1) {
        pcVar59[lVar39 + 0x50] = local_1e30[lVar39 * 4];
      }
      for (lVar39 = 0; lVar39 != 4; lVar39 = lVar39 + 1) {
        pcVar59[lVar39 + 0x54] = local_1cd0[lVar39 * 4];
      }
      *(float *)(pcVar60 + uVar4 * 0x90 + 0x68) = fVar123;
      *(float *)(pcVar60 + uVar4 * 0x90 + 0x74) = local_1ef0;
      auVar24._8_8_ = uStack_17f8;
      auVar24._0_8_ = local_1800;
      fVar151 = (float)local_1800;
      fVar152 = (float)((ulong)local_1800 >> 0x20);
      fVar154 = (float)uStack_17f8;
      fVar155 = (float)((ulong)uStack_17f8 >> 0x20);
      auVar25._8_8_ = uStack_17e8;
      auVar25._0_8_ = local_17f0;
      fVar148 = (float)local_17f0;
      fVar143 = (float)((ulong)local_17f0 >> 0x20);
      fVar147 = (float)uStack_17e8;
      fVar153 = (float)((ulong)uStack_17e8 >> 0x20);
      uVar63 = -(uint)(fVar151 != INFINITY);
      uVar65 = -(uint)(fVar152 != INFINITY);
      uVar66 = -(uint)(fVar154 != INFINITY);
      uVar67 = -(uint)(fVar155 != INFINITY);
      auVar82._4_4_ = fVar151;
      auVar82._0_4_ = fVar152;
      auVar82._8_4_ = fVar155;
      auVar82._12_4_ = fVar154;
      auVar73 = minps(auVar82,auVar24);
      auVar128._0_8_ = auVar73._8_8_;
      auVar128._8_4_ = auVar73._0_4_;
      auVar128._12_4_ = auVar73._4_4_;
      auVar146 = minps(auVar128,auVar73);
      auVar83._4_4_ = fVar148;
      auVar83._0_4_ = fVar143;
      auVar83._8_4_ = fVar153;
      auVar83._12_4_ = fVar147;
      auVar73 = maxps(auVar83,auVar25);
      auVar18._4_8_ = uStack_17e8;
      auVar18._0_4_ = auVar73._4_4_;
      auVar110._0_8_ = auVar18._0_8_ << 0x20;
      auVar110._8_4_ = auVar73._8_4_;
      auVar110._12_4_ = auVar73._12_4_;
      uVar120 = auVar110._8_8_;
      auVar111._8_8_ = auVar73._8_8_;
      auVar111._0_8_ = uVar120;
      if (auVar73._8_4_ <= auVar73._0_4_) {
        auVar112._4_12_ = auVar111._4_12_;
        auVar112._0_4_ = auVar73._0_4_;
        uVar120 = auVar112._0_8_;
      }
      fVar123 = auVar146._0_4_;
      fVar95 = ((float)uVar120 - fVar123) * 1.0000002;
      uVar64 = -(uint)(fVar95 / 255.0 == 0.0);
      local_1ef0 = (float)(uVar64 & 0x1000000 | ~uVar64 & (uint)(fVar95 / 255.0));
      fVar135 = (float)(-(uint)(0.0 < fVar95) & (uint)(255.0 / fVar95));
      fVar95 = floorf((fVar154 - fVar123) * fVar135);
      fVar68 = floorf((fVar155 - fVar123) * fVar135);
      fVar69 = floorf((fVar151 - fVar123) * fVar135);
      fVar70 = floorf((fVar152 - fVar123) * fVar135);
      uVar96 = ~((int)fVar69 >> 0x1f) & (int)fVar69;
      uVar118 = ~((int)fVar70 >> 0x1f) & (int)fVar70;
      uVar119 = ~((int)fVar95 >> 0x1f) & (int)fVar95;
      uVar121 = ~((int)fVar68 >> 0x1f) & (int)fVar68;
      fVar95 = ceilf((fVar147 - fVar123) * fVar135);
      fVar68 = ceilf((fVar153 - fVar123) * fVar135);
      fVar69 = ceilf((fVar148 - fVar123) * fVar135);
      fVar70 = ceilf((fVar143 - fVar123) * fVar135);
      uVar64 = -(uint)(0xfe < (int)fVar69);
      uVar89 = -(uint)(0xfe < (int)fVar70);
      uVar91 = -(uint)(0xfe < (int)fVar95);
      uVar93 = -(uint)(0xfe < (int)fVar68);
      uVar71 = uVar64 & 0xff | ~uVar64 & (int)fVar69;
      uVar90 = uVar89 & 0xff | ~uVar89 & (int)fVar70;
      uVar92 = uVar91 & 0xff | ~uVar91 & (int)fVar95;
      uVar94 = uVar93 & 0xff | ~uVar93 & (int)fVar68;
      uVar64 = -(uint)((float)(int)uVar96 * local_1ef0 + fVar123 <= fVar151);
      uVar89 = -(uint)((float)(int)uVar118 * local_1ef0 + fVar123 <= fVar152);
      uVar91 = -(uint)((float)(int)uVar119 * local_1ef0 + fVar123 <= fVar154);
      uVar93 = -(uint)((float)(int)uVar121 * local_1ef0 + fVar123 <= fVar155);
      uVar96 = ~uVar64 & uVar96 - 1 | uVar96 & uVar64;
      uVar118 = ~uVar89 & uVar118 - 1 | uVar118 & uVar89;
      uVar119 = ~uVar91 & uVar119 - 1 | uVar119 & uVar91;
      uVar121 = ~uVar93 & uVar121 - 1 | uVar121 & uVar93;
      uVar64 = -(uint)(fVar148 <= (float)(int)uVar71 * local_1ef0 + fVar123);
      uVar89 = -(uint)(fVar143 <= (float)(int)uVar90 * local_1ef0 + fVar123);
      uVar91 = -(uint)(fVar147 <= (float)(int)uVar92 * local_1ef0 + fVar123);
      uVar93 = -(uint)(fVar153 <= (float)(int)uVar94 * local_1ef0 + fVar123);
      uVar71 = ~uVar64 & uVar71 + 1 | uVar71 & uVar64;
      uVar90 = ~uVar89 & uVar90 + 1 | uVar90 & uVar89;
      uVar92 = ~uVar91 & uVar92 + 1 | uVar92 & uVar91;
      uVar94 = ~uVar93 & uVar94 + 1 | uVar94 & uVar93;
      uVar64 = -(uint)(0xfe < (int)uVar71);
      uVar89 = -(uint)(0xfe < (int)uVar90);
      uVar91 = -(uint)(0xfe < (int)uVar92);
      uVar93 = -(uint)(0xfe < (int)uVar94);
      local_1e30._4_4_ = ~uVar65 & 0xff | ~((int)uVar118 >> 0x1f) & uVar118 & uVar65;
      local_1e30._0_4_ = ~uVar63 & 0xff | ~((int)uVar96 >> 0x1f) & uVar96 & uVar63;
      uStack_1e28._0_4_ = ~uVar66 & 0xff | ~((int)uVar119 >> 0x1f) & uVar119 & uVar66;
      uStack_1e28._4_4_ = ~uVar67 & 0xff | ~((int)uVar121 >> 0x1f) & uVar121 & uVar67;
      local_1cd0._4_4_ = (uVar89 & 0xff | ~uVar89 & uVar90) & uVar65;
      local_1cd0._0_4_ = (uVar64 & 0xff | ~uVar64 & uVar71) & uVar63;
      uStack_1cc8._0_4_ = (uVar91 & 0xff | ~uVar91 & uVar92) & uVar66;
      uStack_1cc8._4_4_ = (uVar93 & 0xff | ~uVar93 & uVar94) & uVar67;
      for (lVar39 = 0; lVar39 != 4; lVar39 = lVar39 + 1) {
        pcVar59[lVar39 + 0x58] = local_1e30[lVar39 * 4];
      }
      for (lVar39 = 0; lVar39 != 4; lVar39 = lVar39 + 1) {
        pcVar59[lVar39 + 0x5c] = local_1cd0[lVar39 * 4];
      }
      *(float *)(pcVar60 + uVar4 * 0x90 + 0x6c) = fVar123;
      *(float *)(pcVar60 + uVar4 * 0x90 + 0x78) = local_1ef0;
      auVar26._8_8_ = uStack_17d8;
      auVar26._0_8_ = local_17e0;
      fVar151 = (float)local_17e0;
      fVar152 = (float)((ulong)local_17e0 >> 0x20);
      fVar154 = (float)uStack_17d8;
      fVar155 = (float)((ulong)uStack_17d8 >> 0x20);
      auVar27._8_8_ = uStack_17c8;
      auVar27._0_8_ = local_17d0;
      fVar148 = (float)local_17d0;
      fVar143 = (float)((ulong)local_17d0 >> 0x20);
      fVar147 = (float)uStack_17c8;
      fVar153 = (float)((ulong)uStack_17c8 >> 0x20);
      local_1eb0._4_4_ = -(uint)(fVar152 != INFINITY);
      local_1eb0._0_4_ = -(uint)(fVar151 != INFINITY);
      local_1eb0._8_4_ = -(uint)(fVar154 != INFINITY);
      local_1eb0._12_4_ = -(uint)(fVar155 != INFINITY);
      auVar84._4_4_ = fVar151;
      auVar84._0_4_ = fVar152;
      auVar84._8_4_ = fVar155;
      auVar84._12_4_ = fVar154;
      auVar73 = minps(auVar84,auVar26);
      auVar129._0_8_ = auVar73._8_8_;
      auVar129._8_4_ = auVar73._0_4_;
      auVar129._12_4_ = auVar73._4_4_;
      auVar146 = minps(auVar129,auVar73);
      auVar85._4_4_ = fVar148;
      auVar85._0_4_ = fVar143;
      auVar85._8_4_ = fVar153;
      auVar85._12_4_ = fVar147;
      auVar73 = maxps(auVar85,auVar27);
      auVar19._4_8_ = uStack_17c8;
      auVar19._0_4_ = auVar73._4_4_;
      auVar113._0_8_ = auVar19._0_8_ << 0x20;
      auVar113._8_4_ = auVar73._8_4_;
      auVar113._12_4_ = auVar73._12_4_;
      uVar120 = auVar113._8_8_;
      auVar114._8_8_ = auVar73._8_8_;
      auVar114._0_8_ = uVar120;
      if (auVar73._8_4_ <= auVar73._0_4_) {
        auVar115._4_12_ = auVar114._4_12_;
        auVar115._0_4_ = auVar73._0_4_;
        uVar120 = auVar115._0_8_;
      }
      fVar123 = auVar146._0_4_;
      fVar95 = ((float)uVar120 - fVar123) * 1.0000002;
      uVar63 = -(uint)(fVar95 / 255.0 == 0.0);
      fVar135 = (float)(uVar63 & 0x1000000 | ~uVar63 & (uint)(fVar95 / 255.0));
      fVar136 = (float)(-(uint)(0.0 < fVar95) & (uint)(255.0 / fVar95));
      fVar95 = floorf((fVar154 - fVar123) * fVar136);
      fVar68 = floorf((fVar155 - fVar123) * fVar136);
      fVar69 = floorf((fVar151 - fVar123) * fVar136);
      fVar70 = floorf((fVar152 - fVar123) * fVar136);
      uVar71 = ~((int)fVar69 >> 0x1f) & (int)fVar69;
      uVar90 = ~((int)fVar70 >> 0x1f) & (int)fVar70;
      uVar92 = ~((int)fVar95 >> 0x1f) & (int)fVar95;
      uVar94 = ~((int)fVar68 >> 0x1f) & (int)fVar68;
      fVar95 = ceilf((fVar147 - fVar123) * fVar136);
      fVar68 = ceilf((fVar153 - fVar123) * fVar136);
      fVar69 = ceilf((fVar148 - fVar123) * fVar136);
      fVar70 = ceilf((fVar143 - fVar123) * fVar136);
      auVar116._0_4_ = (int)fVar69;
      auVar116._4_4_ = (int)fVar70;
      auVar116._8_4_ = (int)fVar95;
      auVar116._12_4_ = (int)fVar68;
      auVar86._0_4_ = -(uint)((int)DAT_01f57510 < auVar116._0_4_);
      auVar86._4_4_ = -(uint)(DAT_01f57510._4_4_ < auVar116._4_4_);
      auVar86._8_4_ = -(uint)(DAT_01f57510._8_4_ < auVar116._8_4_);
      auVar86._12_4_ = -(uint)(DAT_01f57510._12_4_ < auVar116._12_4_);
      auVar73 = auVar86 & _DAT_01f57520 | ~auVar86 & auVar116;
      uVar64 = auVar73._0_4_;
      uVar89 = auVar73._4_4_;
      uVar91 = auVar73._8_4_;
      uVar93 = auVar73._12_4_;
      uVar63 = -(uint)((float)(int)uVar71 * fVar135 + fVar123 <= fVar151);
      uVar65 = -(uint)((float)(int)uVar90 * fVar135 + fVar123 <= fVar152);
      uVar66 = -(uint)((float)(int)uVar92 * fVar135 + fVar123 <= fVar154);
      uVar67 = -(uint)((float)(int)uVar94 * fVar135 + fVar123 <= fVar155);
      auVar142._0_4_ = uVar71 & uVar63;
      auVar142._4_4_ = uVar90 & uVar65;
      auVar142._8_4_ = uVar92 & uVar66;
      auVar142._12_4_ = uVar94 & uVar67;
      auVar117._0_4_ = ~uVar63 & uVar71 - 1;
      auVar117._4_4_ = ~uVar65 & uVar90 - 1;
      auVar117._8_4_ = ~uVar66 & uVar92 - 1;
      auVar117._12_4_ = ~uVar67 & uVar94 - 1;
      auVar117 = auVar117 | auVar142;
      auVar122._0_4_ = auVar117._0_4_ >> 0x1f;
      auVar122._4_4_ = auVar117._4_4_ >> 0x1f;
      auVar122._8_4_ = auVar117._8_4_ >> 0x1f;
      auVar122._12_4_ = auVar117._12_4_ >> 0x1f;
      uVar63 = -(uint)(fVar148 <= (float)(int)uVar64 * fVar135 + fVar123);
      uVar65 = -(uint)(fVar143 <= (float)(int)uVar89 * fVar135 + fVar123);
      uVar66 = -(uint)(fVar147 <= (float)(int)uVar91 * fVar135 + fVar123);
      uVar67 = -(uint)(fVar153 <= (float)(int)uVar93 * fVar135 + fVar123);
      auVar87._0_4_ = uVar64 & uVar63;
      auVar87._4_4_ = uVar89 & uVar65;
      auVar87._8_4_ = uVar91 & uVar66;
      auVar87._12_4_ = uVar93 & uVar67;
      auVar130._0_4_ = ~uVar63 & uVar64 + 1;
      auVar130._4_4_ = ~uVar65 & uVar89 + 1;
      auVar130._8_4_ = ~uVar66 & uVar91 + 1;
      auVar130._12_4_ = ~uVar67 & uVar93 + 1;
      auVar130 = auVar130 | auVar87;
      auVar88._0_4_ = -(uint)((int)DAT_01f57510 < auVar130._0_4_);
      auVar88._4_4_ = -(uint)(DAT_01f57510._4_4_ < auVar130._4_4_);
      auVar88._8_4_ = -(uint)(DAT_01f57510._8_4_ < auVar130._8_4_);
      auVar88._12_4_ = -(uint)(DAT_01f57510._12_4_ < auVar130._12_4_);
      _local_1e30 = (anon_union_16_2_47237d3f_for_Vec3fa_0)
                    (~local_1eb0 & _DAT_01f57520 | ~auVar122 & auVar117 & local_1eb0);
      _local_1cd0 = (anon_union_16_2_47237d3f_for_Vec3fa_0)
                    ((auVar88 & _DAT_01f57520 | ~auVar88 & auVar130) & local_1eb0);
      for (lVar39 = 0; lVar39 != 4; lVar39 = lVar39 + 1) {
        pcVar59[lVar39 + 0x60] = local_1e30[lVar39 * 4];
      }
      for (lVar39 = 0; lVar39 != 4; lVar39 = lVar39 + 1) {
        pcVar59[lVar39 + 100] = local_1cd0[lVar39 * 4];
      }
      *(float *)(pcVar60 + uVar4 * 0x90 + 0x70) = fVar123;
      *(float *)(pcVar60 + uVar4 * 0x90 + 0x7c) = fVar135;
      pcVar59 = pcVar59 + 0x90;
    }
    (local_1e58->ref).ptr = local_1c40 | 8;
    *(undefined8 *)&(local_1e58->lbounds).bounds0.lower.field_0 = local_1e70._0_8_;
    *(undefined8 *)((long)&(local_1e58->lbounds).bounds0.lower.field_0 + 8) = local_1e70._8_8_;
    *(undefined8 *)&(local_1e58->lbounds).bounds0.upper.field_0 = local_1d60._0_8_;
    *(undefined8 *)((long)&(local_1e58->lbounds).bounds0.upper.field_0 + 8) = local_1d60._8_8_;
    *(undefined8 *)&(local_1e58->lbounds).bounds1.lower.field_0 = local_1e50._0_8_;
    *(undefined8 *)((long)&(local_1e58->lbounds).bounds1.lower.field_0 + 8) = local_1e50._8_8_;
    *(undefined1 (*) [8])&(local_1e58->lbounds).bounds1.upper.field_0 = local_1d70;
    *(undefined8 *)((long)&(local_1e58->lbounds).bounds1.upper.field_0 + 8) = uStack_1d68;
    BVar20.upper = (float)local_1930._156_4_;
    BVar20.lower = (float)local_1930._152_4_;
    local_1e58->dt = BVar20;
    return local_1e58;
  }
  local_1eb0._0_8_ = &local_1240;
  array_t<embree::sse2::BVHBuilderMSMBlur::BuildRecordSplit,_16UL>::array_t
            ((array_t<embree::sse2::BVHBuilderMSMBlur::BuildRecordSplit,_16UL> *)local_1eb0._0_8_);
  local_2c0 = 1;
  local_1e70._0_8_ = 1;
  local_b8 = 1;
  BuildRecordSplit::operator=((BuildRecordSplit *)local_1eb0._0_8_,(BuildRecordSplit *)local_1930);
  local_2b8 = (PrimRefVector)local_1930._160_8_;
  local_2b0[0] = (PrimRefVector)0x2;
  local_340[0] = &local_2b8;
  local_1e50._0_8_ = &this->heuristicTemporalSplit;
  uVar57 = 0;
  local_1f20._8_8_ = 0x7f8000007f800000;
  local_1f20._0_8_ = 0x7f8000007f800000;
  local_1f30._8_8_ = 0xff800000ff800000;
  local_1f30._0_8_ = 0xff800000ff800000;
  do {
    local_1ec0._0_8_ = uVar57;
    prVar51 = &local_1230.super_PrimInfoMB.object_range;
    uVar52 = 0;
    uVar43 = 0xffffffffffffffff;
    for (uVar55 = 0; local_2c0 != uVar55; uVar55 = uVar55 + 1) {
      uVar56 = prVar51->_end - prVar51->_begin;
      if ((((this->cfg).maxLeafSize < uVar56) || (1 < *(uint *)((long)(prVar51 + 4) + 0xc))) ||
         (bVar61)) {
        if (uVar52 < uVar56) {
          uVar43 = uVar55;
          uVar52 = uVar56;
        }
        bVar61 = false;
      }
      prVar51 = prVar51 + 0xf;
    }
    if (uVar43 == 0xffffffffffffffff) break;
    lVar39 = uVar43 * 0xf0;
    local_1c20._0_8_ = (ThreadLocal2 *)(local_1930._0_8_ + 1);
    local_1b70.sah = INFINITY;
    local_1b70.dim = -1;
    local_1b70.field_2 = (anon_union_4_2_620955e9_for_BinSplit<32UL>_3)0x0;
    local_1b70.data = 0;
    local_1ab0.super_BuildRecord.depth = local_1930._0_8_ + 1;
    local_1ab0.split.sah = INFINITY;
    local_1ab0.split.dim = -1;
    local_1ab0.split.field_2 = (anon_union_4_2_620955e9_for_BinSplit<32UL>_3)0x0;
    local_1ab0.split.data = 0;
    if (3 < *(uint *)(local_1190 + lVar39 + 0xc)) goto LAB_004fdd0b;
    this_00 = (SetMB *)((long)&local_1230 + uVar43 * 0xf0);
    switch(*(uint *)(local_1190 + lVar39 + 0xc)) {
    case 0:
      uStack_1e28 = 0x7f8000007f800000;
      local_1e30 = (undefined1  [8])0x7f8000007f800000;
      local_1e20._0_8_ = 0xff800000ff800000;
      local_1e20._8_8_ = 0xff800000ff800000;
      local_1e10._0_8_ = 0x7f8000007f800000;
      local_1e10._8_8_ = 0x7f8000007f800000;
      local_1e00._0_8_ = 0xff800000ff800000;
      local_1e00._8_8_ = 0xff800000ff800000;
      local_1df0._0_8_ = 0x7f8000007f800000;
      local_1df0._8_8_ = 0x7f8000007f800000;
      local_1de0._0_8_ = 0xff800000ff800000;
      local_1de0._8_8_ = 0xff800000ff800000;
      local_1dc0 = 0;
      sStack_1db8 = 0;
      local_1dd0 = 0;
      uStack_1dc8 = 0;
      local_1db0 = 0.0;
      local_1dac = 1.0;
      fStack_1da8 = 1.0;
      local_1da4 = 0.0;
      local_19c0._0_8_ = local_1190 + lVar39;
      uStack_1cc8 = 0x7f8000007f800000;
      local_1cd0 = (undefined1  [8])0x7f8000007f800000;
      local_1cc0._0_8_ = 0xff800000ff800000;
      local_1cc0._8_8_ = 0xff800000ff800000;
      local_1cb0._0_8_ = 0x7f8000007f800000;
      local_1cb0._8_8_ = 0x7f8000007f800000;
      local_1ca0._0_8_ = 0xff800000ff800000;
      local_1ca0._8_8_ = 0xff800000ff800000;
      local_1c90._0_8_ = 0x7f8000007f800000;
      local_1c90._8_8_ = 0x7f8000007f800000;
      local_1c80._0_8_ = 0xff800000ff800000;
      local_1c80._8_8_ = 0xff800000ff800000;
      local_1c60 = 0;
      sStack_1c58 = 0;
      local_1c70 = 0;
      uStack_1c68 = 0;
      local_1c50 = 0.0;
      local_1c4c._0_4_ = 1.0;
      local_1c4c._4_4_ = 1.0;
      local_1c44 = 0.0;
      sVar44 = *(size_t *)(local_1190 + (uVar43 * 0x1e + -1) * 8 + -0x38);
      end = *(size_t *)(local_1190 + uVar43 * 0xf0 + -0x38);
      local_1b30.m128[1] = (float)*(undefined4 *)(local_1190 + lVar39 + 8);
      local_1b30._0_4_ = local_1b30.m128[1];
      local_1b30.m128[3] = local_1b30.m128[1];
      local_1b30._8_4_ = local_1b30.m128[1];
      lVar39 = (long)(1 << (local_1190[lVar39 + 4] & 0x1f)) * 0x10;
      local_1d20._0_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar39);
      local_1d20._8_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar39 + 8);
      local_19c0._8_8_ = &local_1b30;
      local_19b0 = &local_1d20;
      sVar40 = parallel_partitioning<embree::PrimRefMB,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::EmptyTy,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimRefMB_const&)_1_,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_>
                         (*(PrimRefMB **)(*(long *)(local_1190 + uVar43 * 0xf0 + -0x10) + 0x20),
                          sVar44,end,(EmptyTy *)local_1d50,
                          (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_1e30,
                          (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_1cd0,
                          (anon_class_24_3_c5d13451 *)&local_19c0.field_1,
                          (anon_class_1_0_00000001 *)&local_1d90.field_1,
                          (anon_class_1_0_00000001 *)&local_1cf0,0x80,0xc00);
      pmVar48 = *(PrimRefVector *)(local_1190 + uVar43 * 0xf0 + -0x10);
      uVar4 = *(undefined8 *)(local_1190 + uVar43 * 0xf0 + -0x18);
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_1c10[0].field_1,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_1e30);
      local_1ef0 = (float)uVar4;
      fStack_1eec = (float)((ulong)uVar4 >> 0x20);
      uVar63 = -(uint)(local_1b88.lower < local_1ef0);
      uVar65 = -(uint)(local_1b88.upper < fStack_1eec);
      local_1b88 = (BBox1f)(CONCAT44(~uVar65 & (uint)fStack_1eec,~uVar63 & (uint)local_1b88.lower) |
                           CONCAT44((uint)local_1b88.upper & uVar65,(uint)local_1ef0 & uVar63));
      pmVar7 = *(PrimRefVector *)(local_1190 + uVar43 * 0xf0 + -0x10);
      uVar4 = *(undefined8 *)(local_1190 + uVar43 * 0xf0 + -0x18);
      local_1bb0 = sVar44;
      local_1ba8 = sVar40;
      local_1b80 = pmVar48;
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                (&local_1ab0.super_BuildRecord.prims.super_PrimInfoMB,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_1cd0);
      local_1ef0 = (float)uVar4;
      fStack_1eec = (float)((ulong)uVar4 >> 0x20);
      uVar63 = -(uint)(local_1ab0.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower <
                      local_1ef0);
      uVar65 = -(uint)(local_1ab0.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper <
                      fStack_1eec);
      local_1ab0.super_BuildRecord.prims.super_PrimInfoMB.time_range =
           (BBox1f)(CONCAT44(~uVar65 & (uint)fStack_1eec,
                             ~uVar63 & (uint)local_1ab0.super_BuildRecord.prims.super_PrimInfoMB.
                                             time_range.lower) |
                   CONCAT44((uint)local_1ab0.super_BuildRecord.prims.super_PrimInfoMB.time_range.
                                  upper & uVar65,(uint)local_1ef0 & uVar63));
      local_1ab0.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin = sVar40;
      local_1ab0.super_BuildRecord.prims.super_PrimInfoMB.object_range._end = end;
      local_1ab0.super_BuildRecord.prims.prims = pmVar7;
      break;
    case 1:
      SetMB::deterministic_order(this_00);
      splitFallback(this,this_00,(SetMB *)&local_1c10[0].field_1,&local_1ab0.super_BuildRecord.prims
                   );
      break;
    case 2:
      local_1e80 = CONCAT44(*(float *)(local_1190 + lVar39 + 8),
                            *(undefined4 *)(local_1190 + uVar43 * 0xf0 + -0x18));
      local_1e88.upper = *(float *)(local_1190 + lVar39 + -0x14);
      local_1e88.lower = *(float *)(local_1190 + lVar39 + 8);
      pmVar10 = *(mvector<embree::PrimRefMB> **)(local_1190 + uVar43 * 0xf0 + -0x10);
      pvVar41 = (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                 *)::operator_new(0x28);
      pMVar9 = *(MemoryMonitorInterface **)local_1e50._0_8_;
      pvVar41->items = (PrimRefMB *)0x0;
      paVar49 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 **)(local_1190 + uVar43 * 0xf0 + -0x38);
      lVar39 = *(long *)(local_1190 + (uVar43 * 0x1e + -1) * 8 + -0x38);
      (pvVar41->alloc).device = pMVar9;
      (pvVar41->alloc).hugepages = false;
      pvVar41->size_active = 0;
      pvVar41->size_alloced = 0;
      sVar44 = (long)paVar49 - lVar39;
      paVar53 = paVar49;
      if (sVar44 != 0) {
        uVar52 = sVar44 * 0x50;
        (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,uVar52,0);
        if (uVar52 < 0x1c00000) {
          pPVar42 = (PrimRefMB *)alignedMalloc(uVar52,0x10);
        }
        else {
          pPVar42 = (PrimRefMB *)os_malloc(uVar52,&(pvVar41->alloc).hugepages);
        }
        pvVar41->items = pPVar42;
        pvVar41->size_active = sVar44;
        pvVar41->size_alloced = sVar44;
        paVar49 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 **)
                   (local_1190 + (uVar43 * 0x1e + -1) * 8 + -0x38);
        paVar53 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 **)(local_1190 + uVar43 * 0xf0 + -0x38);
      }
      local_1d20._8_8_ = &local_1e80;
      local_1d10._0_8_ = local_1e50._0_8_;
      local_1d10._8_8_ = &local_1e38;
      uStack_1e28 = 0x7f8000007f800000;
      local_1e30 = (undefined1  [8])0x7f8000007f800000;
      local_1e20._0_8_ = 0xff800000ff800000;
      local_1e20._8_8_ = 0xff800000ff800000;
      local_1e10._0_8_ = 0x7f8000007f800000;
      local_1e10._8_8_ = 0x7f8000007f800000;
      local_1e00._0_8_ = 0xff800000ff800000;
      local_1e00._8_8_ = 0xff800000ff800000;
      local_1df0._0_8_ = 0x7f8000007f800000;
      local_1df0._8_8_ = 0x7f8000007f800000;
      local_1de0._0_8_ = 0xff800000ff800000;
      local_1de0._8_8_ = 0xff800000ff800000;
      local_1dc0 = 0;
      sStack_1db8 = 0;
      local_1dd0 = 0;
      uStack_1dc8 = 0;
      local_1db0 = 0.0;
      local_1dac = 1.0;
      fStack_1da8 = 1.0;
      local_1da4 = 0.0;
      local_1e90._M_head_impl = pvVar41;
      local_1e38._M_head_impl = pvVar41;
      local_1d20._0_8_ = pmVar10;
      local_1d00._0_8_ = this_00;
      if ((ulong)((long)paVar53 - (long)paVar49) < 0xc00) {
        local_19c0._0_8_ = paVar49;
        local_19c0._8_8_ = paVar53;
        ::anon_func::anon_class_40_5_808acc65::operator()
                  ((PrimInfoMB *)local_1cd0,(anon_class_40_5_808acc65 *)&local_1d20.field_1,
                   (range<unsigned_long> *)&local_19c0.field_1);
      }
      else {
        tbb::detail::d1::task_group_context::task_group_context
                  ((task_group_context *)&local_19c0.field_1,(context_traits)0x4,CUSTOM_CTX);
        local_1b20 = (undefined8 *)0x80;
        local_1d90._0_8_ = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        local_1d90._8_8_ = &local_1d20;
        local_1b30._0_8_ = paVar53;
        local_1b30._8_8_ = paVar49;
        tbb::detail::d1::
        parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::GridRecalculatePrimRef,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::GridRecalculatePrimRef,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                  ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_1cd0,
                   (d1 *)&local_1b30.field_1,(blocked_range<unsigned_long> *)local_1e30,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_1d90.field_1,
                   (anon_class_16_2_ed117de8_conflict20 *)
                   PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                   (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                    *)&local_19c0,in_stack_ffffffffffffe080);
        cVar37 = tbb::detail::r1::is_group_execution_cancelled
                           ((task_group_context *)&local_19c0.field_1);
        if (cVar37 != '\0') {
          prVar46 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar46,"task cancelled");
          __cxa_throw(prVar46,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        tbb::detail::d1::task_group_context::~task_group_context
                  ((task_group_context *)&local_19c0.field_1);
      }
      if (uStack_1c68 - local_1c70 !=
          *(long *)(local_1190 + uVar43 * 0xf0 + -0x38) -
          *(long *)(local_1190 + (uVar43 * 0x1e + -1) * 8 + -0x38)) {
        local_1e30 = (undefined1  [8])&local_1e80;
        uStack_1c68 = parallel_filter<embree::PrimRefMB,unsigned_long,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::GridRecalculatePrimRef,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_>
                                ((local_1e38._M_head_impl)->items,0,
                                 *(long *)(local_1190 + uVar43 * 0xf0 + -0x38) -
                                 *(long *)(local_1190 + (uVar43 * 0x1e + -1) * 8 + -0x38),0x400,
                                 (anon_class_8_1_41ce32a5 *)local_1e30);
      }
      _Var36._M_head_impl = local_1e38._M_head_impl;
      uStack_1d68 = 0;
      local_1d70 = (undefined1  [8])local_1e80;
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_1e30,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_1cd0);
      local_1da0 = _Var36._M_head_impl;
      uVar52 = CONCAT44(~-(uint)(local_1da4 < (float)local_1d70._4_4_) & local_1d70._4_4_,
                        ~-(uint)(fStack_1da8 < (float)local_1d70._0_4_) & (uint)fStack_1da8) |
               CONCAT44((uint)local_1da4 & -(uint)(local_1da4 < (float)local_1d70._4_4_),
                        local_1d70._0_4_ & -(uint)(fStack_1da8 < (float)local_1d70._0_4_));
      fStack_1da8 = (float)uVar52;
      local_1da4 = (float)(uVar52 >> 0x20);
      SetMB::operator=((SetMB *)&local_1c10[0].field_1,(SetMB *)local_1e30);
      local_1cf0.time_range1 = &local_1e88;
      local_1cf0.this =
           (HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::sse2::VirtualRecalculatePrimRef,_2UL>
            *)local_1e50._0_8_;
      paVar49 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 **)
                 (local_1190 + (uVar43 * 0x1e + -1) * 8 + -0x38);
      uStack_1e28 = 0x7f8000007f800000;
      local_1e30 = (undefined1  [8])0x7f8000007f800000;
      local_1e20._0_8_ = 0xff800000ff800000;
      local_1e20._8_8_ = 0xff800000ff800000;
      local_1e10._0_8_ = 0x7f8000007f800000;
      local_1e10._8_8_ = 0x7f8000007f800000;
      local_1e00._0_8_ = 0xff800000ff800000;
      local_1e00._8_8_ = 0xff800000ff800000;
      local_1df0._0_8_ = 0x7f8000007f800000;
      local_1df0._8_8_ = 0x7f8000007f800000;
      local_1de0._0_8_ = 0xff800000ff800000;
      local_1de0._8_8_ = 0xff800000ff800000;
      local_1dc0 = 0;
      sStack_1db8 = 0;
      local_1dd0 = 0;
      uStack_1dc8 = 0;
      local_1db0 = 0.0;
      local_1dac = 1.0;
      fStack_1da8 = 1.0;
      local_1da4 = 0.0;
      paVar53 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 **)(local_1190 + uVar43 * 0xf0 + -0x38);
      local_1cf0.prims = pmVar10;
      if ((ulong)((long)paVar53 - (long)paVar49) < 0xc00) {
        local_1b30._0_8_ = paVar49;
        local_1b30._8_8_ = paVar53;
        ::anon_func::anon_class_24_3_35f68c7c::operator()
                  ((PrimInfoMB *)&local_19c0.field_1,&local_1cf0,
                   (range<unsigned_long> *)&local_1b30.field_1);
      }
      else {
        tbb::detail::d1::task_group_context::task_group_context
                  ((task_group_context *)&local_1b30.field_1,(context_traits)0x4,CUSTOM_CTX);
        local_1d80 = 0x80;
        local_1d50._0_8_ = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        local_1d50._8_8_ = &local_1cf0;
        local_1d90._0_8_ = paVar53;
        local_1d90._8_8_ = paVar49;
        tbb::detail::d1::
        parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::GridRecalculatePrimRef,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::GridRecalculatePrimRef,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                  ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_19c0.field_1,
                   (d1 *)&local_1d90.field_1,(blocked_range<unsigned_long> *)local_1e30,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_1d50,
                   (anon_class_16_2_ed117de8_conflict21 *)
                   PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                   (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                    *)&local_1b30,in_stack_ffffffffffffe080);
        cVar37 = tbb::detail::r1::is_group_execution_cancelled
                           ((task_group_context *)&local_1b30.field_1);
        if (cVar37 != '\0') {
          prVar46 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar46,"task cancelled");
          __cxa_throw(prVar46,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        tbb::detail::d1::task_group_context::~task_group_context
                  ((task_group_context *)&local_1b30.field_1);
      }
      lVar39 = local_1958 - local_1960;
      local_1960 = *(unsigned_long *)(local_1190 + (uVar43 * 0x1e + -1) * 8 + -0x38);
      local_1958 = lVar39 + local_1960;
      if (lVar39 != *(unsigned_long *)(local_1190 + uVar43 * 0xf0 + -0x38) - local_1960) {
        local_1e30 = (undefined1  [8])&local_1e88;
        local_1958 = parallel_filter<embree::PrimRefMB,unsigned_long,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::GridRecalculatePrimRef,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_2_>
                               (pmVar10->items,local_1960,
                                *(unsigned_long *)(local_1190 + uVar43 * 0xf0 + -0x38),0x400,
                                (anon_class_8_1_41ce32a6 *)local_1e30);
      }
      BVar21 = local_1e88;
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_1e30,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_19c0.field_1);
      local_1ef0 = BVar21.lower;
      fStack_1eec = BVar21.upper;
      uVar52 = CONCAT44(~-(uint)(local_1da4 < fStack_1eec) & (uint)fStack_1eec,
                        ~-(uint)(fStack_1da8 < local_1ef0) & (uint)fStack_1da8) |
               CONCAT44((uint)local_1da4 & -(uint)(local_1da4 < fStack_1eec),
                        (uint)local_1ef0 & -(uint)(fStack_1da8 < local_1ef0));
      fStack_1da8 = (float)uVar52;
      local_1da4 = (float)(uVar52 >> 0x20);
      local_1da0 = pmVar10;
      SetMB::operator=(&local_1ab0.super_BuildRecord.prims,(SetMB *)local_1e30);
      bVar62 = local_1e90._M_head_impl !=
               (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                *)0x0;
      goto LAB_004fdd26;
    case 3:
      SetMB::deterministic_order(this_00);
      splitByGeometry(this,this_00,(SetMB *)&local_1c10[0].field_1,
                      &local_1ab0.super_BuildRecord.prims);
    }
LAB_004fdd0b:
    local_1e90._M_head_impl =
         (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
          *)0x0;
    bVar62 = false;
LAB_004fdd26:
    findFallback((Split *)local_1e30,this,(SetMB *)&local_1c10[0].field_1);
    aVar132 = _local_1e30;
    local_1b70.sah = (float)local_1e30._0_4_;
    local_1b70.dim = local_1e30._4_4_;
    local_1b70.field_2 = (anon_union_4_2_620955e9_for_BinSplit<32UL>_3)(undefined4)uStack_1e28;
    local_1b70.data = uStack_1e28._4_4_;
    local_1b70.mapping.num = local_1e20._0_8_;
    local_1b70.mapping.ofs.field_0._0_8_ = local_1e10._0_8_;
    local_1b70.mapping.ofs.field_0._8_8_ = local_1e10._8_8_;
    local_1b70.mapping.scale.field_0._0_8_ = local_1e00._0_8_;
    local_1b70.mapping.scale.field_0._8_8_ = local_1e00._8_8_;
    _local_1e30 = aVar132;
    findFallback((Split *)local_1e30,this,&local_1ab0.super_BuildRecord.prims);
    lVar39 = local_b8;
    aVar132 = _local_1e30;
    local_1ab0.split.sah = (float)local_1e30._0_4_;
    local_1ab0.split.dim = local_1e30._4_4_;
    local_1ab0.split.field_2 = (anon_union_4_2_620955e9_for_BinSplit<32UL>_3)(undefined4)uStack_1e28
    ;
    local_1ab0.split.data = uStack_1e28._4_4_;
    local_1ab0.split.mapping.num = local_1e20._0_8_;
    local_1ab0.split.mapping.ofs.field_0._0_8_ = local_1e10._0_8_;
    local_1ab0.split.mapping.ofs.field_0._8_8_ = local_1e10._8_8_;
    local_1ab0.split.mapping.scale.field_0._0_8_ = local_1e00._0_8_;
    local_1ab0.split.mapping.scale.field_0._8_8_ = local_1e00._8_8_;
    local_1e40._M_head_impl = local_1e90._M_head_impl;
    local_1e90._M_head_impl =
         (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
          *)0x0;
    ppmVar8 = local_340[uVar43];
    if (local_1b80 == *ppmVar8) {
      ppmVar8[1] = (PrimRefVector)((long)&(ppmVar8[1]->alloc).device + 1);
      pmVar48 = local_1b80;
    }
    else {
      lVar34 = local_b8 * 2;
      lVar35 = local_b8 * 2;
      local_b8 = local_b8 + 1;
      local_2b0[lVar35 + -1] = local_1b80;
      local_2b0[lVar39 * 2] = (PrimRefVector)0x1;
      local_340[uVar43] = local_2b0 + lVar34 + -1;
      pmVar48 = *ppmVar8;
    }
    lVar39 = local_b8;
    if (local_1ab0.super_BuildRecord.prims.prims == pmVar48) {
      local_340[local_2c0] = ppmVar8;
      pmVar48 = ppmVar8[1];
      ppmVar8[1] = (PrimRefVector)((long)&(pmVar48->alloc).device + 1);
    }
    else {
      lVar34 = local_b8 * 2;
      lVar35 = local_b8 * 2;
      local_b8 = local_b8 + 1;
      local_2b0[lVar35 + -1] = local_1ab0.super_BuildRecord.prims.prims;
      local_2b0[lVar39 * 2] = (PrimRefVector)0x1;
      local_340[local_2c0] = local_2b0 + lVar34 + -1;
      pmVar48 = (PrimRefVector)((long)&ppmVar8[1][-1].items + 7);
    }
    ppmVar8[1] = pmVar48;
    _local_1e30 = aVar132;
    if (pmVar48 == (PrimRefVector)0x0) {
      pmVar48 = *ppmVar8;
      if (pmVar48 != (PrimRefVector)0x0) {
        sVar44 = pmVar48->size_alloced;
        pPVar42 = pmVar48->items;
        if (pPVar42 != (PrimRefMB *)0x0) {
          if (sVar44 * 0x50 < 0x1c00000) {
            alignedFree(pPVar42);
          }
          else {
            os_free(pPVar42,sVar44 * 0x50,(pmVar48->alloc).hugepages);
          }
        }
        if (sVar44 != 0) {
          pMVar9 = (pmVar48->alloc).device;
          (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,sVar44 * -0x50,1);
        }
        pmVar48->size_active = 0;
        pmVar48->size_alloced = 0;
        pmVar48->items = (PrimRefMB *)0x0;
      }
      ::operator_delete(pmVar48);
    }
    local_1e40._M_head_impl =
         (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
          *)0x0;
    BuildRecordSplit::operator=
              ((BuildRecordSplit *)&(&local_1240)[uVar43 * 0xf].field_1,
               (BuildRecordSplit *)local_1c20);
    BuildRecordSplit::operator=
              ((BuildRecordSplit *)&(&local_1240)[local_2c0 * 0xf].field_1,&local_1ab0);
    uVar57 = (ulong)(byte)((byte)uVar57 | bVar62);
    local_2c0 = local_2c0 + 1;
    std::
    unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ::~unique_ptr((unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                   *)&local_1e40);
    std::
    unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ::~unique_ptr((unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                   *)&local_1e90);
  } while (local_2c0 < (this->cfg).branchingFactor);
  pfVar50 = &local_1230.super_PrimInfoMB.time_range.upper;
  uVar43 = local_2c0;
  while( true ) {
    bVar61 = uVar43 == 0;
    uVar43 = uVar43 - 1;
    if (bVar61) break;
    uVar57 = (ulong)(byte)((byte)uVar57 |
                          -(*pfVar50 < *(float *)(local_1d60._0_8_ + 0x9c) ||
                           *(float *)(local_1d60._0_8_ + 0x98) < ((BBox1f *)(pfVar50 + -1))->lower))
    ;
    pfVar50 = pfVar50 + 0x3c;
  }
  local_1ec0._0_8_ = uVar57;
  if ((uVar57 & 1) == 0) {
    local_1cd0 = (undefined1  [8])0xe0;
    pTVar38 = (alloc.talloc0)->parent;
    if (alloc.alloc != (pTVar38->alloc)._M_b._M_p) {
      local_1ab0.super_BuildRecord._8_1_ = 1;
      local_1ab0.super_BuildRecord.depth = (size_t)pTVar38;
      MutexSys::lock(&pTVar38->mutex);
      if ((pTVar38->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar1 = &((pTVar38->alloc)._M_b._M_p)->bytesUsed;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar38->alloc1).bytesUsed + (pTVar38->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar38->alloc)._M_b._M_p)->bytesFree;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar38->alloc0).end + (pTVar38->alloc1).end) -
             ((pTVar38->alloc0).cur + (pTVar38->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar38->alloc)._M_b._M_p)->bytesWasted;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar38->alloc1).bytesWasted + (pTVar38->alloc0).bytesWasted;
        UNLOCK();
      }
      (pTVar38->alloc0).bytesUsed = 0;
      (pTVar38->alloc0).bytesWasted = 0;
      (pTVar38->alloc0).end = 0;
      (pTVar38->alloc0).allocBlockSize = 0;
      (pTVar38->alloc0).ptr = (char *)0x0;
      (pTVar38->alloc0).cur = 0;
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar38->alloc1).bytesUsed = 0;
        (pTVar38->alloc1).bytesWasted = 0;
        (pTVar38->alloc1).end = 0;
        (pTVar38->alloc1).allocBlockSize = 0;
        (pTVar38->alloc1).ptr = (char *)0x0;
        (pTVar38->alloc1).cur = 0;
      }
      else {
        (pTVar38->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar38->alloc1).ptr = (char *)0x0;
        (pTVar38->alloc1).cur = 0;
        (pTVar38->alloc1).end = 0;
        (pTVar38->alloc1).allocBlockSize = 0;
        (pTVar38->alloc1).bytesUsed = 0;
        (pTVar38->alloc1).bytesWasted = 0;
        (pTVar38->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar38->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      local_1e30 = (undefined1  [8])pTVar38;
      local_1c20._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
      local_1c20[8] = 1;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      std::
      vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
      ::push_back(&(alloc.alloc)->thread_local_allocators,(value_type *)local_1e30);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)local_1c20);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&local_1ab0);
    }
    (alloc.talloc0)->bytesUsed = (alloc.talloc0)->bytesUsed + (long)local_1cd0;
    sVar44 = (alloc.talloc0)->cur;
    uVar57 = (ulong)(-(int)sVar44 & 0xf);
    uVar43 = sVar44 + (long)local_1cd0 + uVar57;
    (alloc.talloc0)->cur = uVar43;
    if ((alloc.talloc0)->end < uVar43) {
      (alloc.talloc0)->cur = sVar44;
      if ((ThreadLocal2 *)(alloc.talloc0)->allocBlockSize < (ThreadLocal2 *)((long)local_1cd0 << 2))
      {
        pcVar59 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)local_1cd0);
      }
      else {
        local_1c20._0_8_ = (ThreadLocal2 *)(alloc.talloc0)->allocBlockSize;
        pcVar59 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)local_1c20);
        (alloc.talloc0)->ptr = pcVar59;
        sVar44 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar44;
        (alloc.talloc0)->end = local_1c20._0_8_;
        (alloc.talloc0)->cur = (size_t)local_1cd0;
        if ((ulong)local_1c20._0_8_ < (ulong)local_1cd0) {
          (alloc.talloc0)->cur = 0;
          local_1c20._0_8_ = (alloc.talloc0)->allocBlockSize;
          pcVar59 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)local_1c20);
          (alloc.talloc0)->ptr = pcVar59;
          sVar44 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
          (alloc.talloc0)->bytesWasted = sVar44;
          (alloc.talloc0)->end = local_1c20._0_8_;
          (alloc.talloc0)->cur = (size_t)local_1cd0;
          if ((ulong)local_1c20._0_8_ < (ulong)local_1cd0) {
            (alloc.talloc0)->cur = 0;
            pcVar59 = (char *)0x0;
            goto LAB_004feb71;
          }
        }
        (alloc.talloc0)->bytesWasted = sVar44;
      }
    }
    else {
      (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar57;
      pcVar59 = (alloc.talloc0)->ptr + (uVar43 - (long)local_1cd0);
    }
LAB_004feb71:
    pcVar59[0x60] = '\0';
    pcVar59[0x61] = '\0';
    pcVar59[0x62] = -0x80;
    pcVar59[99] = '\x7f';
    pcVar59[100] = '\0';
    pcVar59[0x65] = '\0';
    pcVar59[0x66] = -0x80;
    pcVar59[0x67] = '\x7f';
    pcVar59[0x68] = '\0';
    pcVar59[0x69] = '\0';
    pcVar59[0x6a] = -0x80;
    pcVar59[0x6b] = '\x7f';
    pcVar59[0x6c] = '\0';
    pcVar59[0x6d] = '\0';
    pcVar59[0x6e] = -0x80;
    pcVar59[0x6f] = '\x7f';
    pcVar59[0x40] = '\0';
    pcVar59[0x41] = '\0';
    pcVar59[0x42] = -0x80;
    pcVar59[0x43] = '\x7f';
    pcVar59[0x44] = '\0';
    pcVar59[0x45] = '\0';
    pcVar59[0x46] = -0x80;
    pcVar59[0x47] = '\x7f';
    pcVar59[0x48] = '\0';
    pcVar59[0x49] = '\0';
    pcVar59[0x4a] = -0x80;
    pcVar59[0x4b] = '\x7f';
    pcVar59[0x4c] = '\0';
    pcVar59[0x4d] = '\0';
    pcVar59[0x4e] = -0x80;
    pcVar59[0x4f] = '\x7f';
    pcVar59[0x20] = '\0';
    pcVar59[0x21] = '\0';
    pcVar59[0x22] = -0x80;
    pcVar59[0x23] = '\x7f';
    pcVar59[0x24] = '\0';
    pcVar59[0x25] = '\0';
    pcVar59[0x26] = -0x80;
    pcVar59[0x27] = '\x7f';
    pcVar59[0x28] = '\0';
    pcVar59[0x29] = '\0';
    pcVar59[0x2a] = -0x80;
    pcVar59[0x2b] = '\x7f';
    pcVar59[0x2c] = '\0';
    pcVar59[0x2d] = '\0';
    pcVar59[0x2e] = -0x80;
    pcVar59[0x2f] = '\x7f';
    pcVar59[0x70] = '\0';
    pcVar59[0x71] = '\0';
    pcVar59[0x72] = -0x80;
    pcVar59[0x73] = -1;
    pcVar59[0x74] = '\0';
    pcVar59[0x75] = '\0';
    pcVar59[0x76] = -0x80;
    pcVar59[0x77] = -1;
    pcVar59[0x78] = '\0';
    pcVar59[0x79] = '\0';
    pcVar59[0x7a] = -0x80;
    pcVar59[0x7b] = -1;
    pcVar59[0x7c] = '\0';
    pcVar59[0x7d] = '\0';
    pcVar59[0x7e] = -0x80;
    pcVar59[0x7f] = -1;
    pcVar59[0x50] = '\0';
    pcVar59[0x51] = '\0';
    pcVar59[0x52] = -0x80;
    pcVar59[0x53] = -1;
    pcVar59[0x54] = '\0';
    pcVar59[0x55] = '\0';
    pcVar59[0x56] = -0x80;
    pcVar59[0x57] = -1;
    pcVar59[0x58] = '\0';
    pcVar59[0x59] = '\0';
    pcVar59[0x5a] = -0x80;
    pcVar59[0x5b] = -1;
    pcVar59[0x5c] = '\0';
    pcVar59[0x5d] = '\0';
    pcVar59[0x5e] = -0x80;
    pcVar59[0x5f] = -1;
    pcVar59[0x30] = '\0';
    pcVar59[0x31] = '\0';
    pcVar59[0x32] = -0x80;
    pcVar59[0x33] = -1;
    pcVar59[0x34] = '\0';
    pcVar59[0x35] = '\0';
    pcVar59[0x36] = -0x80;
    pcVar59[0x37] = -1;
    pcVar59[0x38] = '\0';
    pcVar59[0x39] = '\0';
    pcVar59[0x3a] = -0x80;
    pcVar59[0x3b] = -1;
    pcVar59[0x3c] = '\0';
    pcVar59[0x3d] = '\0';
    pcVar59[0x3e] = -0x80;
    pcVar59[0x3f] = -1;
    pcVar59[0x80] = '\0';
    pcVar59[0x81] = '\0';
    pcVar59[0x82] = '\0';
    pcVar59[0x83] = '\0';
    pcVar59[0x84] = '\0';
    pcVar59[0x85] = '\0';
    pcVar59[0x86] = '\0';
    pcVar59[0x87] = '\0';
    pcVar59[0x88] = '\0';
    pcVar59[0x89] = '\0';
    pcVar59[0x8a] = '\0';
    pcVar59[0x8b] = '\0';
    pcVar59[0x8c] = '\0';
    pcVar59[0x8d] = '\0';
    pcVar59[0x8e] = '\0';
    pcVar59[0x8f] = '\0';
    pcVar59[0x90] = '\0';
    pcVar59[0x91] = '\0';
    pcVar59[0x92] = '\0';
    pcVar59[0x93] = '\0';
    pcVar59[0x94] = '\0';
    pcVar59[0x95] = '\0';
    pcVar59[0x96] = '\0';
    pcVar59[0x97] = '\0';
    pcVar59[0x98] = '\0';
    pcVar59[0x99] = '\0';
    pcVar59[0x9a] = '\0';
    pcVar59[0x9b] = '\0';
    pcVar59[0x9c] = '\0';
    pcVar59[0x9d] = '\0';
    pcVar59[0x9e] = '\0';
    pcVar59[0x9f] = '\0';
    pcVar59[0xa0] = '\0';
    pcVar59[0xa1] = '\0';
    pcVar59[0xa2] = '\0';
    pcVar59[0xa3] = '\0';
    pcVar59[0xa4] = '\0';
    pcVar59[0xa5] = '\0';
    pcVar59[0xa6] = '\0';
    pcVar59[0xa7] = '\0';
    pcVar59[0xa8] = '\0';
    pcVar59[0xa9] = '\0';
    pcVar59[0xaa] = '\0';
    pcVar59[0xab] = '\0';
    pcVar59[0xac] = '\0';
    pcVar59[0xad] = '\0';
    pcVar59[0xae] = '\0';
    pcVar59[0xaf] = '\0';
    pcVar59[0xb0] = '\0';
    pcVar59[0xb1] = '\0';
    pcVar59[0xb2] = '\0';
    pcVar59[0xb3] = '\0';
    pcVar59[0xb4] = '\0';
    pcVar59[0xb5] = '\0';
    pcVar59[0xb6] = '\0';
    pcVar59[0xb7] = '\0';
    pcVar59[0xb8] = '\0';
    pcVar59[0xb9] = '\0';
    pcVar59[0xba] = '\0';
    pcVar59[0xbb] = '\0';
    pcVar59[0xbc] = '\0';
    pcVar59[0xbd] = '\0';
    pcVar59[0xbe] = '\0';
    pcVar59[0xbf] = '\0';
    pcVar59[0xc0] = '\0';
    pcVar59[0xc1] = '\0';
    pcVar59[0xc2] = '\0';
    pcVar59[0xc3] = '\0';
    pcVar59[0xc4] = '\0';
    pcVar59[0xc5] = '\0';
    pcVar59[0xc6] = '\0';
    pcVar59[199] = '\0';
    pcVar59[200] = '\0';
    pcVar59[0xc9] = '\0';
    pcVar59[0xca] = '\0';
    pcVar59[0xcb] = '\0';
    pcVar59[0xcc] = '\0';
    pcVar59[0xcd] = '\0';
    pcVar59[0xce] = '\0';
    pcVar59[0xcf] = '\0';
    pcVar59[0xd0] = '\0';
    pcVar59[0xd1] = '\0';
    pcVar59[0xd2] = '\0';
    pcVar59[0xd3] = '\0';
    pcVar59[0xd4] = '\0';
    pcVar59[0xd5] = '\0';
    pcVar59[0xd6] = '\0';
    pcVar59[0xd7] = '\0';
    pcVar59[0xd8] = '\0';
    pcVar59[0xd9] = '\0';
    pcVar59[0xda] = '\0';
    pcVar59[0xdb] = '\0';
    pcVar59[0xdc] = '\0';
    pcVar59[0xdd] = '\0';
    pcVar59[0xde] = '\0';
    pcVar59[0xdf] = '\0';
    for (lVar39 = 0; lVar39 != 4; lVar39 = lVar39 + 1) {
      pcVar60 = pcVar59 + lVar39 * 8;
      pcVar60[0] = '\b';
      pcVar60[1] = '\0';
      pcVar60[2] = '\0';
      pcVar60[3] = '\0';
      pcVar60[4] = '\0';
      pcVar60[5] = '\0';
      pcVar60[6] = '\0';
      pcVar60[7] = '\0';
    }
    goto LAB_004febe5;
  }
  local_1cd0 = (undefined1  [8])0x100;
  pTVar38 = (alloc.talloc0)->parent;
  if (alloc.alloc != (pTVar38->alloc)._M_b._M_p) {
    local_1ab0.super_BuildRecord._8_1_ = 1;
    local_1ab0.super_BuildRecord.depth = (size_t)pTVar38;
    MutexSys::lock(&pTVar38->mutex);
    if ((pTVar38->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((pTVar38->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar38->alloc1).bytesUsed + (pTVar38->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar38->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((pTVar38->alloc0).end + (pTVar38->alloc1).end) -
           ((pTVar38->alloc0).cur + (pTVar38->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar38->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar38->alloc1).bytesWasted + (pTVar38->alloc0).bytesWasted;
      UNLOCK();
    }
    (pTVar38->alloc0).bytesUsed = 0;
    (pTVar38->alloc0).bytesWasted = 0;
    (pTVar38->alloc0).end = 0;
    (pTVar38->alloc0).allocBlockSize = 0;
    (pTVar38->alloc0).ptr = (char *)0x0;
    (pTVar38->alloc0).cur = 0;
    if (alloc.alloc == (FastAllocator *)0x0) {
      (pTVar38->alloc1).bytesUsed = 0;
      (pTVar38->alloc1).bytesWasted = 0;
      (pTVar38->alloc1).end = 0;
      (pTVar38->alloc1).allocBlockSize = 0;
      (pTVar38->alloc1).ptr = (char *)0x0;
      (pTVar38->alloc1).cur = 0;
    }
    else {
      (pTVar38->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (pTVar38->alloc1).ptr = (char *)0x0;
      (pTVar38->alloc1).cur = 0;
      (pTVar38->alloc1).end = 0;
      (pTVar38->alloc1).allocBlockSize = 0;
      (pTVar38->alloc1).bytesUsed = 0;
      (pTVar38->alloc1).bytesWasted = 0;
      (pTVar38->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (pTVar38->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    local_1e30 = (undefined1  [8])pTVar38;
    local_1c20._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
    local_1c20[8] = 1;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    std::
    vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ::push_back(&(alloc.alloc)->thread_local_allocators,(value_type *)local_1e30);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)local_1c20);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&local_1ab0);
  }
  (alloc.talloc0)->bytesUsed = (alloc.talloc0)->bytesUsed + (long)local_1cd0;
  sVar44 = (alloc.talloc0)->cur;
  uVar57 = (ulong)(-(int)sVar44 & 0xf);
  uVar43 = sVar44 + (long)local_1cd0 + uVar57;
  (alloc.talloc0)->cur = uVar43;
  if ((alloc.talloc0)->end < uVar43) {
    (alloc.talloc0)->cur = sVar44;
    if ((ThreadLocal2 *)(alloc.talloc0)->allocBlockSize < (ThreadLocal2 *)((long)local_1cd0 << 2)) {
      pcVar59 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)local_1cd0);
    }
    else {
      local_1c20._0_8_ = (ThreadLocal2 *)(alloc.talloc0)->allocBlockSize;
      pcVar59 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)local_1c20);
      (alloc.talloc0)->ptr = pcVar59;
      sVar44 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar44;
      (alloc.talloc0)->end = local_1c20._0_8_;
      (alloc.talloc0)->cur = (size_t)local_1cd0;
      if ((ulong)local_1c20._0_8_ < (ulong)local_1cd0) {
        (alloc.talloc0)->cur = 0;
        local_1c20._0_8_ = (alloc.talloc0)->allocBlockSize;
        pcVar59 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)local_1c20);
        (alloc.talloc0)->ptr = pcVar59;
        sVar44 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar44;
        (alloc.talloc0)->end = local_1c20._0_8_;
        (alloc.talloc0)->cur = (size_t)local_1cd0;
        if ((ulong)local_1c20._0_8_ < (ulong)local_1cd0) {
          (alloc.talloc0)->cur = 0;
          pcVar59 = (char *)0x0;
          goto LAB_004fea35;
        }
      }
      (alloc.talloc0)->bytesWasted = sVar44;
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar57;
    pcVar59 = (alloc.talloc0)->ptr + (uVar43 - (long)local_1cd0);
  }
LAB_004fea35:
  pcVar59[0xe0] = '\0';
  pcVar59[0xe1] = '\0';
  pcVar59[0xe2] = -0x80;
  pcVar59[0xe3] = '\x7f';
  pcVar59[0xe4] = '\0';
  pcVar59[0xe5] = '\0';
  pcVar59[0xe6] = -0x80;
  pcVar59[0xe7] = '\x7f';
  pcVar59[0xe8] = '\0';
  pcVar59[0xe9] = '\0';
  pcVar59[0xea] = -0x80;
  pcVar59[0xeb] = '\x7f';
  pcVar59[0xec] = '\0';
  pcVar59[0xed] = '\0';
  pcVar59[0xee] = -0x80;
  pcVar59[0xef] = '\x7f';
  pcVar59[0xf0] = '\0';
  pcVar59[0xf1] = '\0';
  pcVar59[0xf2] = -0x80;
  pcVar59[0xf3] = -1;
  pcVar59[0xf4] = '\0';
  pcVar59[0xf5] = '\0';
  pcVar59[0xf6] = -0x80;
  pcVar59[0xf7] = -1;
  pcVar59[0xf8] = '\0';
  pcVar59[0xf9] = '\0';
  pcVar59[0xfa] = -0x80;
  pcVar59[0xfb] = -1;
  pcVar59[0xfc] = '\0';
  pcVar59[0xfd] = '\0';
  pcVar59[0xfe] = -0x80;
  pcVar59[0xff] = -1;
  pcVar59[0x60] = '\0';
  pcVar59[0x61] = '\0';
  pcVar59[0x62] = -0x80;
  pcVar59[99] = '\x7f';
  pcVar59[100] = '\0';
  pcVar59[0x65] = '\0';
  pcVar59[0x66] = -0x80;
  pcVar59[0x67] = '\x7f';
  pcVar59[0x68] = '\0';
  pcVar59[0x69] = '\0';
  pcVar59[0x6a] = -0x80;
  pcVar59[0x6b] = '\x7f';
  pcVar59[0x6c] = '\0';
  pcVar59[0x6d] = '\0';
  pcVar59[0x6e] = -0x80;
  pcVar59[0x6f] = '\x7f';
  pcVar59[0x40] = '\0';
  pcVar59[0x41] = '\0';
  pcVar59[0x42] = -0x80;
  pcVar59[0x43] = '\x7f';
  pcVar59[0x44] = '\0';
  pcVar59[0x45] = '\0';
  pcVar59[0x46] = -0x80;
  pcVar59[0x47] = '\x7f';
  pcVar59[0x48] = '\0';
  pcVar59[0x49] = '\0';
  pcVar59[0x4a] = -0x80;
  pcVar59[0x4b] = '\x7f';
  pcVar59[0x4c] = '\0';
  pcVar59[0x4d] = '\0';
  pcVar59[0x4e] = -0x80;
  pcVar59[0x4f] = '\x7f';
  pcVar59[0x20] = '\0';
  pcVar59[0x21] = '\0';
  pcVar59[0x22] = -0x80;
  pcVar59[0x23] = '\x7f';
  pcVar59[0x24] = '\0';
  pcVar59[0x25] = '\0';
  pcVar59[0x26] = -0x80;
  pcVar59[0x27] = '\x7f';
  pcVar59[0x28] = '\0';
  pcVar59[0x29] = '\0';
  pcVar59[0x2a] = -0x80;
  pcVar59[0x2b] = '\x7f';
  pcVar59[0x2c] = '\0';
  pcVar59[0x2d] = '\0';
  pcVar59[0x2e] = -0x80;
  pcVar59[0x2f] = '\x7f';
  pcVar59[0x70] = '\0';
  pcVar59[0x71] = '\0';
  pcVar59[0x72] = -0x80;
  pcVar59[0x73] = -1;
  pcVar59[0x74] = '\0';
  pcVar59[0x75] = '\0';
  pcVar59[0x76] = -0x80;
  pcVar59[0x77] = -1;
  pcVar59[0x78] = '\0';
  pcVar59[0x79] = '\0';
  pcVar59[0x7a] = -0x80;
  pcVar59[0x7b] = -1;
  pcVar59[0x7c] = '\0';
  pcVar59[0x7d] = '\0';
  pcVar59[0x7e] = -0x80;
  pcVar59[0x7f] = -1;
  pcVar59[0x50] = '\0';
  pcVar59[0x51] = '\0';
  pcVar59[0x52] = -0x80;
  pcVar59[0x53] = -1;
  pcVar59[0x54] = '\0';
  pcVar59[0x55] = '\0';
  pcVar59[0x56] = -0x80;
  pcVar59[0x57] = -1;
  pcVar59[0x58] = '\0';
  pcVar59[0x59] = '\0';
  pcVar59[0x5a] = -0x80;
  pcVar59[0x5b] = -1;
  pcVar59[0x5c] = '\0';
  pcVar59[0x5d] = '\0';
  pcVar59[0x5e] = -0x80;
  pcVar59[0x5f] = -1;
  pcVar59[0x30] = '\0';
  pcVar59[0x31] = '\0';
  pcVar59[0x32] = -0x80;
  pcVar59[0x33] = -1;
  pcVar59[0x34] = '\0';
  pcVar59[0x35] = '\0';
  pcVar59[0x36] = -0x80;
  pcVar59[0x37] = -1;
  pcVar59[0x38] = '\0';
  pcVar59[0x39] = '\0';
  pcVar59[0x3a] = -0x80;
  pcVar59[0x3b] = -1;
  pcVar59[0x3c] = '\0';
  pcVar59[0x3d] = '\0';
  pcVar59[0x3e] = -0x80;
  pcVar59[0x3f] = -1;
  pcVar59[0x80] = '\0';
  pcVar59[0x81] = '\0';
  pcVar59[0x82] = '\0';
  pcVar59[0x83] = '\0';
  pcVar59[0x84] = '\0';
  pcVar59[0x85] = '\0';
  pcVar59[0x86] = '\0';
  pcVar59[0x87] = '\0';
  pcVar59[0x88] = '\0';
  pcVar59[0x89] = '\0';
  pcVar59[0x8a] = '\0';
  pcVar59[0x8b] = '\0';
  pcVar59[0x8c] = '\0';
  pcVar59[0x8d] = '\0';
  pcVar59[0x8e] = '\0';
  pcVar59[0x8f] = '\0';
  pcVar59[0x90] = '\0';
  pcVar59[0x91] = '\0';
  pcVar59[0x92] = '\0';
  pcVar59[0x93] = '\0';
  pcVar59[0x94] = '\0';
  pcVar59[0x95] = '\0';
  pcVar59[0x96] = '\0';
  pcVar59[0x97] = '\0';
  pcVar59[0x98] = '\0';
  pcVar59[0x99] = '\0';
  pcVar59[0x9a] = '\0';
  pcVar59[0x9b] = '\0';
  pcVar59[0x9c] = '\0';
  pcVar59[0x9d] = '\0';
  pcVar59[0x9e] = '\0';
  pcVar59[0x9f] = '\0';
  pcVar59[0xa0] = '\0';
  pcVar59[0xa1] = '\0';
  pcVar59[0xa2] = '\0';
  pcVar59[0xa3] = '\0';
  pcVar59[0xa4] = '\0';
  pcVar59[0xa5] = '\0';
  pcVar59[0xa6] = '\0';
  pcVar59[0xa7] = '\0';
  pcVar59[0xa8] = '\0';
  pcVar59[0xa9] = '\0';
  pcVar59[0xaa] = '\0';
  pcVar59[0xab] = '\0';
  pcVar59[0xac] = '\0';
  pcVar59[0xad] = '\0';
  pcVar59[0xae] = '\0';
  pcVar59[0xaf] = '\0';
  pcVar59[0xb0] = '\0';
  pcVar59[0xb1] = '\0';
  pcVar59[0xb2] = '\0';
  pcVar59[0xb3] = '\0';
  pcVar59[0xb4] = '\0';
  pcVar59[0xb5] = '\0';
  pcVar59[0xb6] = '\0';
  pcVar59[0xb7] = '\0';
  pcVar59[0xb8] = '\0';
  pcVar59[0xb9] = '\0';
  pcVar59[0xba] = '\0';
  pcVar59[0xbb] = '\0';
  pcVar59[0xbc] = '\0';
  pcVar59[0xbd] = '\0';
  pcVar59[0xbe] = '\0';
  pcVar59[0xbf] = '\0';
  pcVar59[0xc0] = '\0';
  pcVar59[0xc1] = '\0';
  pcVar59[0xc2] = '\0';
  pcVar59[0xc3] = '\0';
  pcVar59[0xc4] = '\0';
  pcVar59[0xc5] = '\0';
  pcVar59[0xc6] = '\0';
  pcVar59[199] = '\0';
  pcVar59[200] = '\0';
  pcVar59[0xc9] = '\0';
  pcVar59[0xca] = '\0';
  pcVar59[0xcb] = '\0';
  pcVar59[0xcc] = '\0';
  pcVar59[0xcd] = '\0';
  pcVar59[0xce] = '\0';
  pcVar59[0xcf] = '\0';
  pcVar59[0xd0] = '\0';
  pcVar59[0xd1] = '\0';
  pcVar59[0xd2] = '\0';
  pcVar59[0xd3] = '\0';
  pcVar59[0xd4] = '\0';
  pcVar59[0xd5] = '\0';
  pcVar59[0xd6] = '\0';
  pcVar59[0xd7] = '\0';
  pcVar59[0xd8] = '\0';
  pcVar59[0xd9] = '\0';
  pcVar59[0xda] = '\0';
  pcVar59[0xdb] = '\0';
  pcVar59[0xdc] = '\0';
  pcVar59[0xdd] = '\0';
  pcVar59[0xde] = '\0';
  pcVar59[0xdf] = '\0';
  local_1e70._0_8_ = 6;
  for (lVar39 = 0; lVar39 != 4; lVar39 = lVar39 + 1) {
    pcVar60 = pcVar59 + lVar39 * 8;
    pcVar60[0] = '\b';
    pcVar60[1] = '\0';
    pcVar60[2] = '\0';
    pcVar60[3] = '\0';
    pcVar60[4] = '\0';
    pcVar60[5] = '\0';
    pcVar60[6] = '\0';
    pcVar60[7] = '\0';
  }
LAB_004febe5:
  local_1e70._0_8_ = local_1e70._0_8_ | (ulong)pcVar59;
  puVar45 = &local_17f0;
  local_1f60._8_8_ = 0xff800000ff800000;
  local_1f60._0_8_ = 0xff800000ff800000;
  local_1ed0._8_8_ = 0x7f8000007f800000;
  local_1ed0._0_8_ = 0x7f8000007f800000;
  for (uVar57 = 0; auVar146 = _DAT_01f4b860, auVar73 = _DAT_01f4b850, uVar57 < local_2c0;
      uVar57 = uVar57 + 1) {
    createLargeLeaf((NodeRecordMB4D *)local_1c20,this,(BuildRecord *)local_1eb0._0_8_,alloc);
    puVar45[-10] = local_1c20._0_8_;
    *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(puVar45 + -8) = local_1c10[0];
    *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(puVar45 + -6) = local_1c10[1];
    *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(puVar45 + -4) = local_1c10[2];
    *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(puVar45 + -2) = local_1c10[3];
    *puVar45 = local_1bd0[0]._0_8_;
    local_1ed0 = minps(local_1ed0,(undefined1  [16])local_1c10[0]);
    local_1f60 = maxps(local_1f60,(undefined1  [16])local_1c10[1]);
    local_1f20 = minps(local_1f20,(undefined1  [16])local_1c10[2]);
    local_1f30 = maxps(local_1f30,(undefined1  [16])local_1c10[3]);
    local_1eb0._0_8_ = local_1eb0._0_8_ + 0xf0;
    puVar45 = puVar45 + 0xc;
  }
  uVar57 = (ulong)pcVar59 & 0xfffffffffffffff0;
  if ((local_1e70._0_4_ & 0xf) == 1) {
    pfVar50 = (float *)((long)&local_17f0 + 4);
    for (uVar43 = 0; local_2c0 != uVar43; uVar43 = uVar43 + 1) {
      *(undefined8 *)(uVar57 + uVar43 * 8) = *(undefined8 *)(pfVar50 + -0x15);
      fVar148 = pfVar50[-1];
      fVar147 = 1.0 / (*pfVar50 - fVar148);
      fVar153 = -fVar148 * fVar147;
      fVar143 = 1.0 - fVar153;
      auVar140._0_4_ = pfVar50[-0x11] * fVar143 + pfVar50[-9] * fVar153;
      auVar140._4_4_ = pfVar50[-0x10] * fVar143 + pfVar50[-8] * fVar153;
      auVar140._8_4_ = pfVar50[-0xf] * fVar143 + pfVar50[-7] * fVar153;
      auVar140._12_4_ = pfVar50[-0xe] * fVar143 + pfVar50[-6] * fVar153;
      auVar144._0_4_ = fVar143 * pfVar50[-0xd] + fVar153 * pfVar50[-5];
      auVar144._4_4_ = fVar143 * pfVar50[-0xc] + fVar153 * pfVar50[-4];
      auVar144._8_4_ = fVar143 * pfVar50[-0xb] + fVar153 * pfVar50[-3];
      auVar144._12_4_ = fVar143 * pfVar50[-10] + fVar153 * pfVar50[-2];
      fVar147 = (1.0 - fVar148) * fVar147;
      fVar148 = 1.0 - fVar147;
      auVar150._0_4_ = pfVar50[-0x11] * fVar148 + pfVar50[-9] * fVar147;
      auVar150._4_4_ = pfVar50[-0x10] * fVar148 + pfVar50[-8] * fVar147;
      auVar150._8_4_ = pfVar50[-0xf] * fVar148 + pfVar50[-7] * fVar147;
      auVar150._12_4_ = pfVar50[-0xe] * fVar148 + pfVar50[-6] * fVar147;
      auVar149._0_4_ = fVar148 * pfVar50[-0xd] + fVar147 * pfVar50[-5];
      auVar149._4_4_ = fVar148 * pfVar50[-0xc] + fVar147 * pfVar50[-4];
      auVar149._8_4_ = fVar148 * pfVar50[-0xb] + fVar147 * pfVar50[-3];
      auVar149._12_4_ = fVar148 * pfVar50[-10] + fVar147 * pfVar50[-2];
      auVar141 = minps(auVar140,auVar146);
      auVar145 = maxps(auVar144,auVar73);
      auVar138 = minps(auVar150,auVar146);
      auVar150 = maxps(auVar149,auVar73);
      fVar148 = auVar141._0_4_ - ABS(auVar141._0_4_) * 4.7683716e-07;
      fVar143 = auVar141._4_4_ - ABS(auVar141._4_4_) * 4.7683716e-07;
      fVar147 = auVar141._8_4_ - ABS(auVar141._8_4_) * 4.7683716e-07;
      fVar153 = ABS(auVar145._0_4_) * 4.7683716e-07 + auVar145._0_4_;
      fVar151 = ABS(auVar145._4_4_) * 4.7683716e-07 + auVar145._4_4_;
      fVar152 = ABS(auVar145._8_4_) * 4.7683716e-07 + auVar145._8_4_;
      *(float *)(uVar57 + 0x20 + uVar43 * 4) = fVar148;
      *(float *)(uVar57 + 0x40 + uVar43 * 4) = fVar143;
      *(float *)(uVar57 + 0x60 + uVar43 * 4) = fVar147;
      *(float *)(uVar57 + 0x30 + uVar43 * 4) = fVar153;
      *(float *)(uVar57 + 0x50 + uVar43 * 4) = fVar151;
      *(float *)(uVar57 + 0x70 + uVar43 * 4) = fVar152;
      *(float *)(uVar57 + 0x80 + uVar43 * 4) =
           (auVar138._0_4_ - ABS(auVar138._0_4_) * 4.7683716e-07) - fVar148;
      *(float *)(uVar57 + 0xa0 + uVar43 * 4) =
           (auVar138._4_4_ - ABS(auVar138._4_4_) * 4.7683716e-07) - fVar143;
      *(float *)(uVar57 + 0xc0 + uVar43 * 4) =
           (auVar138._8_4_ - ABS(auVar138._8_4_) * 4.7683716e-07) - fVar147;
      *(float *)(uVar57 + 0x90 + uVar43 * 4) =
           (ABS(auVar150._0_4_) * 4.7683716e-07 + auVar150._0_4_) - fVar153;
      *(float *)(uVar57 + 0xb0 + uVar43 * 4) =
           (ABS(auVar150._4_4_) * 4.7683716e-07 + auVar150._4_4_) - fVar151;
      *(float *)(uVar57 + 0xd0 + uVar43 * 4) =
           (ABS(auVar150._8_4_) * 4.7683716e-07 + auVar150._8_4_) - fVar152;
      pfVar50 = pfVar50 + 0x18;
    }
  }
  else {
    pfVar50 = (float *)((long)&local_17f0 + 4);
    for (uVar43 = 0; local_2c0 != uVar43; uVar43 = uVar43 + 1) {
      *(undefined8 *)(uVar57 + uVar43 * 8) = *(undefined8 *)(pfVar50 + -0x15);
      fVar148 = *pfVar50;
      fVar143 = pfVar50[-1];
      fVar153 = 1.0 / (fVar148 - fVar143);
      fVar151 = -fVar143 * fVar153;
      fVar147 = 1.0 - fVar151;
      auVar138._0_4_ = pfVar50[-0x11] * fVar147 + pfVar50[-9] * fVar151;
      auVar138._4_4_ = pfVar50[-0x10] * fVar147 + pfVar50[-8] * fVar151;
      auVar138._8_4_ = pfVar50[-0xf] * fVar147 + pfVar50[-7] * fVar151;
      auVar138._12_4_ = pfVar50[-0xe] * fVar147 + pfVar50[-6] * fVar151;
      auVar141._0_4_ = fVar147 * pfVar50[-0xd] + fVar151 * pfVar50[-5];
      auVar141._4_4_ = fVar147 * pfVar50[-0xc] + fVar151 * pfVar50[-4];
      auVar141._8_4_ = fVar147 * pfVar50[-0xb] + fVar151 * pfVar50[-3];
      auVar141._12_4_ = fVar147 * pfVar50[-10] + fVar151 * pfVar50[-2];
      fVar153 = (1.0 - fVar143) * fVar153;
      fVar147 = 1.0 - fVar153;
      auVar146._0_4_ = pfVar50[-0x11] * fVar147 + pfVar50[-9] * fVar153;
      auVar146._4_4_ = pfVar50[-0x10] * fVar147 + pfVar50[-8] * fVar153;
      auVar146._8_4_ = pfVar50[-0xf] * fVar147 + pfVar50[-7] * fVar153;
      auVar146._12_4_ = pfVar50[-0xe] * fVar147 + pfVar50[-6] * fVar153;
      auVar145._0_4_ = fVar147 * pfVar50[-0xd] + fVar153 * pfVar50[-5];
      auVar145._4_4_ = fVar147 * pfVar50[-0xc] + fVar153 * pfVar50[-4];
      auVar145._8_4_ = fVar147 * pfVar50[-0xb] + fVar153 * pfVar50[-3];
      auVar145._12_4_ = fVar147 * pfVar50[-10] + fVar153 * pfVar50[-2];
      auVar138 = minps(auVar138,_DAT_01f4b860);
      auVar141 = maxps(auVar141,auVar73);
      auVar146 = minps(auVar146,_DAT_01f4b860);
      auVar145 = maxps(auVar145,auVar73);
      fVar152 = auVar138._0_4_ - ABS(auVar138._0_4_) * 4.7683716e-07;
      fVar154 = auVar138._4_4_ - ABS(auVar138._4_4_) * 4.7683716e-07;
      fVar155 = auVar138._8_4_ - ABS(auVar138._8_4_) * 4.7683716e-07;
      fVar147 = ABS(auVar141._0_4_) * 4.7683716e-07 + auVar141._0_4_;
      fVar153 = ABS(auVar141._4_4_) * 4.7683716e-07 + auVar141._4_4_;
      fVar151 = ABS(auVar141._8_4_) * 4.7683716e-07 + auVar141._8_4_;
      *(float *)(uVar57 + 0x20 + uVar43 * 4) = fVar152;
      *(float *)(uVar57 + 0x40 + uVar43 * 4) = fVar154;
      *(float *)(uVar57 + 0x60 + uVar43 * 4) = fVar155;
      *(float *)(uVar57 + 0x30 + uVar43 * 4) = fVar147;
      *(float *)(uVar57 + 0x50 + uVar43 * 4) = fVar153;
      *(float *)(uVar57 + 0x70 + uVar43 * 4) = fVar151;
      *(float *)(uVar57 + 0x80 + uVar43 * 4) =
           (auVar146._0_4_ - ABS(auVar146._0_4_) * 4.7683716e-07) - fVar152;
      *(float *)(uVar57 + 0xa0 + uVar43 * 4) =
           (auVar146._4_4_ - ABS(auVar146._4_4_) * 4.7683716e-07) - fVar154;
      *(float *)(uVar57 + 0xc0 + uVar43 * 4) =
           (auVar146._8_4_ - ABS(auVar146._8_4_) * 4.7683716e-07) - fVar155;
      *(float *)(uVar57 + 0x90 + uVar43 * 4) =
           (ABS(auVar145._0_4_) * 4.7683716e-07 + auVar145._0_4_) - fVar147;
      *(float *)(uVar57 + 0xb0 + uVar43 * 4) =
           (ABS(auVar145._4_4_) * 4.7683716e-07 + auVar145._4_4_) - fVar153;
      *(float *)(uVar57 + 0xd0 + uVar43 * 4) =
           (ABS(auVar145._8_4_) * 4.7683716e-07 + auVar145._8_4_) - fVar151;
      *(float *)(uVar57 + 0xe0 + uVar43 * 4) = fVar143;
      *(uint *)(uVar57 + 0xf0 + uVar43 * 4) =
           ~-(uint)(fVar148 == 1.0) & (uint)fVar148 | -(uint)(fVar148 == 1.0) & 0x3f800001;
      pfVar50 = pfVar50 + 0x18;
    }
  }
  if ((local_1ec0 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    (local_1e58->ref).ptr = local_1e70._0_8_;
    *(undefined8 *)&(local_1e58->lbounds).bounds0.lower.field_0 = local_1ed0._0_8_;
    *(undefined8 *)((long)&(local_1e58->lbounds).bounds0.lower.field_0 + 8) = local_1ed0._8_8_;
    *(undefined8 *)&(local_1e58->lbounds).bounds0.upper.field_0 = local_1f60._0_8_;
    *(undefined8 *)((long)&(local_1e58->lbounds).bounds0.upper.field_0 + 8) = local_1f60._8_8_;
    *(undefined8 *)&(local_1e58->lbounds).bounds1.lower.field_0 = local_1f20._0_8_;
    *(undefined8 *)((long)&(local_1e58->lbounds).bounds1.lower.field_0 + 8) = local_1f20._8_8_;
  }
  else {
    local_1b30._8_8_ = &this->recalculatePrimRef;
    local_1b30._0_8_ = local_1930 + 0x10;
    local_1ab0.super_BuildRecord.depth = 0x7f8000007f800000;
    local_1ab0.super_BuildRecord._8_8_ = 0x7f8000007f800000;
    local_1ab0.super_BuildRecord.prims.super_PrimInfoMB.
    super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
         0xff800000ff800000;
    local_1ab0.super_BuildRecord.prims.super_PrimInfoMB.
    super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
         0xff800000ff800000;
    local_1ab0.super_BuildRecord.prims.super_PrimInfoMB.
    super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
         0x7f8000007f800000;
    local_1ab0.super_BuildRecord.prims.super_PrimInfoMB.
    super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._8_8_ =
         0x7f8000007f800000;
    local_1ab0.super_BuildRecord.prims.super_PrimInfoMB.
    super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._0_8_ =
         0xff800000ff800000;
    local_1ab0.super_BuildRecord.prims.super_PrimInfoMB.
    super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._8_8_ =
         0xff800000ff800000;
    if ((ulong)(local_1930._120_8_ - local_1930._112_8_) < 0xc00) {
      local_1c20._0_8_ = local_1930._112_8_;
      local_1c20._8_8_ = local_1930._120_8_;
      ::anon_func::anon_class_16_2_aeee9775::operator()
                ((LBBox3fa *)local_1e30,(anon_class_16_2_aeee9775 *)&local_1b30.field_1,
                 (range<unsigned_long> *)local_1c20);
    }
    else {
      tbb::detail::d1::task_group_context::task_group_context
                ((task_group_context *)local_1c20,(context_traits)0x4,CUSTOM_CTX);
      uStack_1cc8 = local_1930._112_8_;
      local_1cd0 = (undefined1  [8])local_1930._120_8_;
      local_1cc0._0_8_ = 0x400;
      local_19c0._0_8_ = &local_1d20;
      local_19c0._8_8_ = &local_1b30;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::LBBox<embree::Vec3fa>,embree::parallel_reduce<unsigned_long,embree::LBBox<embree::Vec3fa>,embree::SetMB::linearBounds<embree::sse2::GridRecalculatePrimRef>(embree::sse2::GridRecalculatePrimRef_const&)const::_lambda(embree::range<unsigned_long>const&)_1_,embree::SetMB::linearBounds<embree::sse2::GridRecalculatePrimRef>(embree::sse2::GridRecalculatePrimRef_const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::LBBox<embree::Vec3fa>const&,embree::SetMB::linearBounds<embree::sse2::GridRecalculatePrimRef>(embree::sse2::GridRecalculatePrimRef_const&)const::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::SetMB::linearBounds<embree::sse2::GridRecalculatePrimRef>(embree::sse2::GridRecalculatePrimRef_const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::LBBox<embree::Vec3fa>const&)_1_,embree::SetMB::linearBounds<embree::sse2::GridRecalculatePrimRef>(embree::sse2::GridRecalculatePrimRef_const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>
                ((LBBox<embree::Vec3fa> *)local_1e30,(d1 *)local_1cd0,
                 (blocked_range<unsigned_long> *)&local_1ab0,
                 (LBBox<embree::Vec3fa> *)&local_19c0.field_1,
                 (anon_class_16_2_ed117de8_conflict22 *)local_19c0._0_8_,
                 (anon_class_1_0_00000001 *)local_1c20,in_stack_ffffffffffffe080);
      cVar37 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)local_1c20);
      if (cVar37 != '\0') {
        prVar46 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar46,"task cancelled");
        __cxa_throw(prVar46,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)local_1c20);
    }
    (local_1e58->ref).ptr = local_1e70._0_8_;
    *(undefined1 (*) [8])&(local_1e58->lbounds).bounds0.lower.field_0 = local_1e30;
    *(undefined8 *)((long)&(local_1e58->lbounds).bounds0.lower.field_0 + 8) = uStack_1e28;
    *(undefined8 *)&(local_1e58->lbounds).bounds0.upper.field_0 = local_1e20._0_8_;
    *(undefined8 *)((long)&(local_1e58->lbounds).bounds0.upper.field_0 + 8) = local_1e20._8_8_;
    *(undefined8 *)&(local_1e58->lbounds).bounds1.lower.field_0 = local_1e10._0_8_;
    *(undefined8 *)((long)&(local_1e58->lbounds).bounds1.lower.field_0 + 8) = local_1e10._8_8_;
    local_1f30._0_8_ = local_1e00._0_8_;
    local_1f30._8_8_ = local_1e00._8_8_;
  }
  *(undefined8 *)&(local_1e58->lbounds).bounds1.upper.field_0 = local_1f30._0_8_;
  *(undefined8 *)((long)&(local_1e58->lbounds).bounds1.upper.field_0 + 8) = local_1f30._8_8_;
  BVar21.upper = (float)local_1930._156_4_;
  BVar21.lower = (float)local_1930._152_4_;
  local_1e58->dt = BVar21;
  for (uVar57 = 0; uVar57 < local_2c0; uVar57 = uVar57 + 1) {
    ppmVar12 = local_340[uVar57];
    ppmVar8 = ppmVar12 + 1;
    *ppmVar8 = (PrimRefVector)((long)&(*ppmVar8)[-1].items + 7);
    if (*ppmVar8 == (PrimRefVector)0x0) {
      pmVar48 = *ppmVar12;
      if (pmVar48 != (PrimRefVector)0x0) {
        sVar44 = pmVar48->size_alloced;
        pPVar42 = pmVar48->items;
        if (pPVar42 != (PrimRefMB *)0x0) {
          if (sVar44 * 0x50 < 0x1c00000) {
            alignedFree(pPVar42);
          }
          else {
            os_free(pPVar42,sVar44 * 0x50,(pmVar48->alloc).hugepages);
          }
        }
        if (sVar44 != 0) {
          pMVar9 = (pmVar48->alloc).device;
          (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,sVar44 * -0x50,1);
        }
        pmVar48->size_active = 0;
        pmVar48->size_alloced = 0;
        pmVar48->items = (PrimRefMB *)0x0;
      }
      ::operator_delete(pmVar48);
    }
  }
  return local_1e58;
}

Assistant:

const NodeRecordMB4D createLargeLeaf(const BuildRecord& in, Allocator alloc)
          {
            /* this should never occur but is a fatal error */
            if (in.depth > cfg.maxDepth)
              throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

            /* replace already found split by fallback split */
            const BuildRecordSplit current(BuildRecord(in.prims,in.depth),findFallback(in.prims));

            /* special case when directly creating leaf without any splits that could shrink time_range */
            bool force_split = false;
            if (current.depth == 1 && current.size() > 0)
            {
              BBox1f c = empty;
              BBox1f p = current.prims.time_range;
              for (size_t i=current.prims.begin(); i<current.prims.end(); i++) {
                mvector<PrimRefMB>& prims = *current.prims.prims;
                c.extend(prims[i].time_range);
              }
              
              force_split = c.lower > p.lower || c.upper < p.upper;
            }
	    
            /* create leaf for few primitives */
            if (current.size() <= cfg.maxLeafSize && current.split.data < Split::SPLIT_ENFORCE && !force_split)
              return createLeaf(current,alloc);
	  
            /* fill all children by always splitting the largest one */
            bool hasTimeSplits = false;
            NodeRecordMB4D values[MAX_BRANCHING_FACTOR];
            LocalChildListSplit children(current);

            do {
              /* find best child with largest bounding box area */
              size_t bestChild = -1;
              size_t bestSize = 0;
              for (size_t i=0; i<children.size(); i++)
              {
                /* ignore leaves as they cannot get split */
                if (children[i].size() <= cfg.maxLeafSize && children[i].split.data < Split::SPLIT_ENFORCE && !force_split)
                  continue;

                force_split = false;
                
                /* remember child with largest size */
                if (children[i].size() > bestSize) {
                  bestSize = children[i].size();
                  bestChild = i;
                }
              }
              if (bestChild == -1) break;

              /* perform best found split */
              BuildRecordSplit& brecord = children[bestChild];
              BuildRecordSplit lrecord(current.depth+1);
              BuildRecordSplit rrecord(current.depth+1);
              std::unique_ptr<mvector<PrimRefMB>> new_vector = split(brecord.split,brecord.prims,lrecord.prims,rrecord.prims);
              hasTimeSplits |= new_vector != nullptr;

              /* find new splits */
              lrecord.split = findFallback(lrecord.prims);
              rrecord.split = findFallback(rrecord.prims);
              children.split(bestChild,lrecord,rrecord,std::move(new_vector));

            } while (children.size() < cfg.branchingFactor);

            /* detect time_ranges that have shrunken */
            for (size_t i=0; i<children.size(); i++) {
              const BBox1f c = children[i].prims.time_range;
              const BBox1f p = in.prims.time_range;
              hasTimeSplits |= c.lower > p.lower || c.upper < p.upper;
            }

            /* create node */
            auto node = createNode(children.children.data(),children.numChildren,alloc,hasTimeSplits);

            /* recurse into each child and perform reduction */
            LBBox3fa gbounds = empty;
            for (size_t i=0; i<children.size(); i++) {
              values[i] = createLargeLeaf(children[i],alloc);
              gbounds.extend(values[i].lbounds);
            }

            setNode(current,children.children.data(),node,values,children.numChildren);

            /* calculate geometry bounds of this node */
            if (hasTimeSplits)
              return NodeRecordMB4D(node,current.prims.linearBounds(recalculatePrimRef),current.prims.time_range);
            else
              return NodeRecordMB4D(node,gbounds,current.prims.time_range);
          }